

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubGridIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  undefined8 *puVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  RTCRayQueryContext *pRVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  long lVar25;
  size_t k;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [28];
  int iVar88;
  uint uVar89;
  uint uVar90;
  ulong uVar91;
  uint uVar92;
  long lVar93;
  undefined1 auVar94 [8];
  long lVar95;
  undefined8 *puVar96;
  ulong uVar97;
  ulong uVar98;
  long lVar99;
  long lVar100;
  NodeRef root;
  ulong uVar101;
  undefined1 (*pauVar102) [32];
  undefined4 uVar103;
  undefined1 unaff_R14 [8];
  ulong *puVar104;
  bool bVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar117 [16];
  float fVar108;
  float fVar109;
  float fVar136;
  float fVar138;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar137;
  float fVar139;
  float fVar141;
  float fVar142;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar140;
  float fVar143;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  __m128 a_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  __m128 a;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar195;
  float fVar196;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  float fVar212;
  float fVar213;
  float fVar216;
  undefined1 auVar214 [12];
  float fVar215;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 in_ZMM13 [64];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 in_ZMM14 [64];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar222;
  undefined1 auVar223 [64];
  Precalculations pre;
  vfloat<4> upper_y;
  vfloat<4> lower_z;
  vbool<8> terminated;
  vfloat<4> upper_z;
  vfloat<4> lower_x;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<4> lower_y;
  TravRayK<8,_true> tray;
  vfloat<4> upper_x;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_3021;
  undefined1 local_3020 [32];
  RTCFilterFunctionNArguments local_2ff0;
  undefined1 local_2fc0 [32];
  undefined1 local_2fa0 [8];
  undefined1 auStack_2f98 [8];
  float fStack_2f90;
  float fStack_2f8c;
  float fStack_2f88;
  RayK<8> *local_2f68;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2f60;
  undefined1 local_2f40 [32];
  undefined1 local_2f20 [8];
  undefined1 auStack_2f18 [24];
  undefined1 local_2f00 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2ee0;
  undefined1 local_2ec0 [32];
  undefined1 local_2ea0 [32];
  undefined1 local_2e80 [8];
  float fStack_2e78;
  float fStack_2e74;
  float fStack_2e70;
  float fStack_2e6c;
  float fStack_2e68;
  undefined1 (*local_2e50) [32];
  ulong local_2e48;
  undefined1 local_2e40 [32];
  undefined1 local_2e20 [32];
  undefined1 local_2e00 [32];
  undefined1 local_2de0 [32];
  undefined1 local_2dc0 [32];
  BVH *local_2d90;
  Intersectors *local_2d88;
  long local_2d80;
  long local_2d78;
  long local_2d70;
  ulong local_2d68;
  undefined1 local_2d60 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2d40;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2d20;
  undefined1 local_2d00 [8];
  undefined1 auStack_2cf8 [8];
  float fStack_2cf0;
  float fStack_2cec;
  float fStack_2ce8;
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2ca0;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 local_2c70;
  undefined8 uStack_2c68;
  undefined1 local_2c60 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2c40;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  uint local_2b80;
  uint uStack_2b7c;
  uint uStack_2b78;
  uint uStack_2b74;
  uint uStack_2b70;
  uint uStack_2b6c;
  uint uStack_2b68;
  uint uStack_2b64;
  uint local_2b60;
  uint uStack_2b5c;
  uint uStack_2b58;
  uint uStack_2b54;
  uint uStack_2b50;
  uint uStack_2b4c;
  uint uStack_2b48;
  uint uStack_2b44;
  uint local_2b40;
  uint uStack_2b3c;
  uint uStack_2b38;
  uint uStack_2b34;
  uint uStack_2b30;
  uint uStack_2b2c;
  uint uStack_2b28;
  uint uStack_2b24;
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2a40;
  RTCRayQueryContext local_2a20 [4];
  uint local_2a00;
  uint uStack_29fc;
  uint uStack_29f8;
  uint uStack_29f4;
  uint local_29f0;
  uint uStack_29ec;
  uint uStack_29e8;
  uint uStack_29e4;
  undefined1 local_29e0 [16];
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2980;
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [8];
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  undefined1 local_28a0 [8];
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  undefined1 local_2880 [8];
  float fStack_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float fStack_2868;
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 local_2790;
  undefined8 uStack_2788;
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 local_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 local_2730;
  undefined8 uStack_2728;
  undefined1 local_2720 [16];
  undefined8 local_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 local_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [32];
  undefined4 local_26a0;
  undefined4 uStack_269c;
  undefined4 uStack_2698;
  undefined4 uStack_2694;
  undefined4 uStack_2690;
  undefined4 uStack_268c;
  undefined4 uStack_2688;
  undefined4 uStack_2684;
  undefined1 local_2680 [32];
  undefined4 local_2660;
  undefined4 uStack_265c;
  undefined4 uStack_2658;
  undefined4 uStack_2654;
  undefined4 uStack_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar127 [32];
  undefined1 auVar194 [64];
  
  local_2608 = (((BVH *)This->ptr)->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar166 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar110 = ZEXT816(0) << 0x40;
      auVar132 = vpcmpeqd_avx2(auVar166,(undefined1  [32])valid_i->field_0);
      auVar166 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar110),5);
      auVar152 = auVar132 & auVar166;
      if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar152 >> 0x7f,0) != '\0') ||
            (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar152 >> 0xbf,0) != '\0') ||
          (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar152[0x1f] < '\0') {
        auVar166 = vandps_avx(auVar166,auVar132);
        auVar147 = vpackssdw_avx(auVar166._0_16_,auVar166._16_16_);
        local_2980._0_8_ = *(undefined8 *)ray;
        local_2980._8_8_ = *(undefined8 *)(ray + 8);
        local_2980._16_8_ = *(undefined8 *)(ray + 0x10);
        local_2980._24_8_ = *(undefined8 *)(ray + 0x18);
        local_2980._32_8_ = *(undefined8 *)(ray + 0x20);
        local_2980._40_8_ = *(undefined8 *)(ray + 0x28);
        local_2980._48_8_ = *(undefined8 *)(ray + 0x30);
        local_2980._56_8_ = *(undefined8 *)(ray + 0x38);
        local_2980._64_8_ = *(undefined8 *)(ray + 0x40);
        local_2980._72_8_ = *(undefined8 *)(ray + 0x48);
        local_2980._80_8_ = *(undefined8 *)(ray + 0x50);
        local_2980._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2920 = *(undefined1 (*) [32])(ray + 0x80);
        local_2900 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2a80._8_4_ = 0x7fffffff;
        local_2a80._0_8_ = 0x7fffffff7fffffff;
        local_2a80._12_4_ = 0x7fffffff;
        local_2a80._16_4_ = 0x7fffffff;
        local_2a80._20_4_ = 0x7fffffff;
        local_2a80._24_4_ = 0x7fffffff;
        local_2a80._28_4_ = 0x7fffffff;
        auVar176._8_4_ = 0x219392ef;
        auVar176._0_8_ = 0x219392ef219392ef;
        auVar176._12_4_ = 0x219392ef;
        auVar176._16_4_ = 0x219392ef;
        auVar176._20_4_ = 0x219392ef;
        auVar176._24_4_ = 0x219392ef;
        auVar176._28_4_ = 0x219392ef;
        auVar127._8_4_ = 0x3f800000;
        auVar127._0_8_ = 0x3f8000003f800000;
        auVar127._12_4_ = 0x3f800000;
        auVar127._16_4_ = 0x3f800000;
        auVar127._20_4_ = 0x3f800000;
        auVar127._24_4_ = 0x3f800000;
        auVar127._28_4_ = 0x3f800000;
        local_28e0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar181 = vdivps_avx(auVar127,local_2920);
        auVar166 = vandps_avx(local_2a80,local_2920);
        auVar152 = vcmpps_avx(auVar166,auVar176,1);
        auVar166 = vandps_avx(local_2a80,local_2900);
        auVar132 = vcmpps_avx(auVar166,auVar176,1);
        auVar203 = ZEXT3264(auVar132);
        auVar186 = vdivps_avx(auVar127,local_2900);
        auVar166 = vandps_avx(local_2a80,local_28e0);
        auVar129._8_4_ = 0x5d5e0b6b;
        auVar129._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar129._12_4_ = 0x5d5e0b6b;
        auVar129._16_4_ = 0x5d5e0b6b;
        auVar129._20_4_ = 0x5d5e0b6b;
        auVar129._24_4_ = 0x5d5e0b6b;
        auVar129._28_4_ = 0x5d5e0b6b;
        auVar207 = ZEXT3264(auVar129);
        _local_28c0 = vblendvps_avx(auVar181,auVar129,auVar152);
        auVar166 = vcmpps_avx(auVar166,auVar176,1);
        auVar152 = vdivps_avx(auVar127,local_28e0);
        _local_28a0 = vblendvps_avx(auVar186,auVar129,auVar132);
        _local_2880 = vblendvps_avx(auVar152,auVar129,auVar166);
        auVar166 = vcmpps_avx(_local_28c0,ZEXT1632(auVar110),1);
        auVar186._8_4_ = 0x10;
        auVar186._0_8_ = 0x1000000010;
        auVar186._12_4_ = 0x10;
        auVar186._16_4_ = 0x10;
        auVar186._20_4_ = 0x10;
        auVar186._24_4_ = 0x10;
        auVar186._28_4_ = 0x10;
        local_2860 = vandps_avx(auVar166,auVar186);
        auVar152 = ZEXT1632(auVar110);
        auVar166 = vcmpps_avx(_local_28a0,auVar152,5);
        auVar132._8_4_ = 0x20;
        auVar132._0_8_ = 0x2000000020;
        auVar132._12_4_ = 0x20;
        auVar132._16_4_ = 0x20;
        auVar132._20_4_ = 0x20;
        auVar132._24_4_ = 0x20;
        auVar132._28_4_ = 0x20;
        auVar128._8_4_ = 0x30;
        auVar128._0_8_ = 0x3000000030;
        auVar128._12_4_ = 0x30;
        auVar128._16_4_ = 0x30;
        auVar128._20_4_ = 0x30;
        auVar128._24_4_ = 0x30;
        auVar128._28_4_ = 0x30;
        local_2840 = vblendvps_avx(auVar128,auVar132,auVar166);
        auVar166 = vcmpps_avx(_local_2880,auVar152,5);
        auVar181._8_4_ = 0x40;
        auVar181._0_8_ = 0x4000000040;
        auVar181._12_4_ = 0x40;
        auVar181._16_4_ = 0x40;
        auVar181._20_4_ = 0x40;
        auVar181._24_4_ = 0x40;
        auVar181._28_4_ = 0x40;
        auVar191._8_4_ = 0x50;
        auVar191._0_8_ = 0x5000000050;
        auVar191._12_4_ = 0x50;
        auVar191._16_4_ = 0x50;
        auVar191._20_4_ = 0x50;
        auVar191._24_4_ = 0x50;
        auVar191._28_4_ = 0x50;
        auVar194 = ZEXT3264(auVar191);
        local_2820 = vblendvps_avx(auVar191,auVar181,auVar166);
        auVar166 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar152);
        local_26c0 = vpmovsxwd_avx2(auVar147);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar209 = ZEXT3264(local_1e80);
        local_2800 = vblendvps_avx(local_1e80,auVar166,local_26c0);
        auVar166 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar152);
        auVar152._8_4_ = 0xff800000;
        auVar152._0_8_ = 0xff800000ff800000;
        auVar152._12_4_ = 0xff800000;
        auVar152._16_4_ = 0xff800000;
        auVar152._20_4_ = 0xff800000;
        auVar152._24_4_ = 0xff800000;
        auVar152._28_4_ = 0xff800000;
        auVar161 = ZEXT3264(auVar152);
        local_27e0 = vblendvps_avx(auVar152,auVar166,local_26c0);
        auVar110 = vpcmpeqd_avx(local_27e0._0_16_,local_27e0._0_16_);
        local_2ce0 = vpmovsxwd_avx2(auVar147 ^ auVar110);
        local_2d88 = This;
        local_2d90 = (BVH *)This->ptr;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar98 = 5;
        }
        else {
          uVar98 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2f68 = ray + 0x100;
        puVar104 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar102 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_2800;
        local_2e50 = (undefined1 (*) [32])&local_2b60;
        auVar210 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar211 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
        local_2e48 = uVar98;
LAB_015d99ff:
        do {
          do {
            root.ptr = puVar104[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_015db849;
            puVar104 = puVar104 + -1;
            pauVar102 = pauVar102 + -1;
            auVar166 = *pauVar102;
            auVar223 = ZEXT3264(auVar166);
            auVar152 = vcmpps_avx(auVar166,local_27e0,1);
          } while ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar152 >> 0x7f,0) == '\0') &&
                     (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar152 >> 0xbf,0) == '\0') &&
                   (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar152[0x1f]);
          uVar103 = vmovmskps_avx(auVar152);
          unaff_R14 = (undefined1  [8])CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar103);
          if (uVar98 < (uint)POPCOUNT(uVar103)) {
LAB_015d9a3e:
            do {
              uVar101 = 8;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_015db849;
                auVar166 = vcmpps_avx(local_27e0,auVar223._0_32_,6);
                if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar166 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar166 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar166 >> 0x7f,0) != '\0') ||
                      (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar166 >> 0xbf,0) != '\0') ||
                    (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar166[0x1f] < '\0') {
                  local_2d80 = (ulong)((uint)root.ptr & 0xf) - 8;
                  uVar101 = root.ptr & 0xfffffffffffffff0;
                  auVar166 = vpcmpeqd_avx2(auVar166,auVar166);
                  auVar223 = ZEXT3264(auVar166 ^ local_2ce0);
                  lVar93 = 0;
                  while (lVar93 != local_2d80) {
                    local_2d78 = lVar93;
                    lVar93 = lVar93 * 0x58;
                    auVar110._8_8_ = 0;
                    auVar110._0_8_ = *(ulong *)(uVar101 + 0x20 + lVar93);
                    auVar147._8_8_ = 0;
                    auVar147._0_8_ = *(ulong *)(uVar101 + 0x24 + lVar93);
                    auVar147 = vpminub_avx(auVar110,auVar147);
                    auVar110 = vpcmpeqb_avx(auVar110,auVar147);
                    auVar147 = vpcmpeqd_avx(auVar147,auVar147);
                    auVar161 = ZEXT1664(auVar147);
                    auVar110 = vpmovzxbd_avx(auVar110 ^ auVar147);
                    auVar110 = vpslld_avx(auVar110 ^ auVar147,0x1f);
                    uVar89 = vmovmskps_avx(auVar110);
                    if (uVar89 != 0) {
                      lVar93 = lVar93 + uVar101;
                      uVar97 = (ulong)(uVar89 & 0xff);
                      local_2d70 = lVar93;
                      do {
                        auVar166 = auVar223._0_32_;
                        local_2e40 = auVar166;
                        lVar25 = 0;
                        for (uVar91 = uVar97; (uVar91 & 1) == 0;
                            uVar91 = uVar91 >> 1 | 0x8000000000000000) {
                          lVar25 = lVar25 + 1;
                        }
                        auVar111._8_8_ = 0;
                        auVar111._0_8_ = *(ulong *)(lVar93 + 0x20);
                        auVar110 = vpmovzxbd_avx(auVar111);
                        auVar110 = vcvtdq2ps_avx(auVar110);
                        uVar103 = *(undefined4 *)(lVar93 + 0x44);
                        auVar148._4_4_ = uVar103;
                        auVar148._0_4_ = uVar103;
                        auVar148._8_4_ = uVar103;
                        auVar148._12_4_ = uVar103;
                        uVar103 = *(undefined4 *)(lVar93 + 0x38);
                        auVar162._4_4_ = uVar103;
                        auVar162._0_4_ = uVar103;
                        auVar162._8_4_ = uVar103;
                        auVar162._12_4_ = uVar103;
                        auVar110 = vfmadd213ps_fma(auVar110,auVar148,auVar162);
                        local_2c40._0_16_ = auVar110;
                        auVar112._8_8_ = 0;
                        auVar112._0_8_ = *(ulong *)(lVar93 + 0x24);
                        auVar110 = vpmovzxbd_avx(auVar112);
                        auVar110 = vcvtdq2ps_avx(auVar110);
                        local_27c0 = vfmadd213ps_fma(auVar110,auVar148,auVar162);
                        auVar113._8_8_ = 0;
                        auVar113._0_8_ = *(ulong *)(lVar93 + 0x28);
                        auVar110 = vpmovzxbd_avx(auVar113);
                        auVar110 = vcvtdq2ps_avx(auVar110);
                        uVar103 = *(undefined4 *)(lVar93 + 0x48);
                        auVar149._4_4_ = uVar103;
                        auVar149._0_4_ = uVar103;
                        auVar149._8_4_ = uVar103;
                        auVar149._12_4_ = uVar103;
                        uVar103 = *(undefined4 *)(lVar93 + 0x3c);
                        auVar163._4_4_ = uVar103;
                        auVar163._0_4_ = uVar103;
                        auVar163._8_4_ = uVar103;
                        auVar163._12_4_ = uVar103;
                        local_29e0 = vfmadd213ps_fma(auVar110,auVar149,auVar163);
                        auVar114._8_8_ = 0;
                        auVar114._0_8_ = *(ulong *)(lVar93 + 0x2c);
                        auVar110 = vpmovzxbd_avx(auVar114);
                        auVar110 = vcvtdq2ps_avx(auVar110);
                        auVar110 = vfmadd213ps_fma(auVar110,auVar149,auVar163);
                        local_2ff0.valid = (int *)auVar110._0_8_;
                        local_2ff0.geometryUserPtr = (void *)auVar110._8_8_;
                        auVar115._8_8_ = 0;
                        auVar115._0_8_ = *(ulong *)(lVar93 + 0x30);
                        auVar110 = vpmovzxbd_avx(auVar115);
                        auVar110 = vcvtdq2ps_avx(auVar110);
                        uVar103 = *(undefined4 *)(lVar93 + 0x4c);
                        auVar150._4_4_ = uVar103;
                        auVar150._0_4_ = uVar103;
                        auVar150._8_4_ = uVar103;
                        auVar150._12_4_ = uVar103;
                        uVar103 = *(undefined4 *)(lVar93 + 0x40);
                        auVar164._4_4_ = uVar103;
                        auVar164._0_4_ = uVar103;
                        auVar164._8_4_ = uVar103;
                        auVar164._12_4_ = uVar103;
                        auVar110 = vfmadd213ps_fma(auVar110,auVar150,auVar164);
                        local_2e00._0_16_ = auVar110;
                        auVar116._8_8_ = 0;
                        auVar116._0_8_ = *(ulong *)(lVar93 + 0x34);
                        auVar110 = vpmovzxbd_avx(auVar116);
                        auVar110 = vcvtdq2ps_avx(auVar110);
                        local_2ca0._0_16_ = vfmadd213ps_fma(auVar110,auVar150,auVar164);
                        uVar91 = (ulong)(uint)((int)lVar25 * 4);
                        uVar103 = *(undefined4 *)((long)&local_2c40 + uVar91);
                        auVar124._4_4_ = uVar103;
                        auVar124._0_4_ = uVar103;
                        auVar124._8_4_ = uVar103;
                        auVar124._12_4_ = uVar103;
                        auVar124._16_4_ = uVar103;
                        auVar124._20_4_ = uVar103;
                        auVar124._24_4_ = uVar103;
                        auVar124._28_4_ = uVar103;
                        auVar80._8_8_ = local_2980._8_8_;
                        auVar80._0_8_ = local_2980._0_8_;
                        auVar80._16_8_ = local_2980._16_8_;
                        auVar80._24_8_ = local_2980._24_8_;
                        auVar82._8_8_ = local_2980._40_8_;
                        auVar82._0_8_ = local_2980._32_8_;
                        auVar82._16_8_ = local_2980._48_8_;
                        auVar82._24_8_ = local_2980._56_8_;
                        auVar84._8_8_ = local_2980._72_8_;
                        auVar84._0_8_ = local_2980._64_8_;
                        auVar84._16_8_ = local_2980._80_8_;
                        auVar84._24_8_ = local_2980._88_8_;
                        auVar152 = vsubps_avx(auVar124,auVar80);
                        auVar27._4_4_ = (float)local_28c0._4_4_ * auVar152._4_4_;
                        auVar27._0_4_ = (float)local_28c0._0_4_ * auVar152._0_4_;
                        auVar27._8_4_ = fStack_28b8 * auVar152._8_4_;
                        auVar27._12_4_ = fStack_28b4 * auVar152._12_4_;
                        auVar27._16_4_ = fStack_28b0 * auVar152._16_4_;
                        auVar27._20_4_ = fStack_28ac * auVar152._20_4_;
                        auVar27._24_4_ = fStack_28a8 * auVar152._24_4_;
                        auVar27._28_4_ = auVar152._28_4_;
                        uVar103 = *(undefined4 *)(local_29e0 + uVar91);
                        auVar192._4_4_ = uVar103;
                        auVar192._0_4_ = uVar103;
                        auVar192._8_4_ = uVar103;
                        auVar192._12_4_ = uVar103;
                        auVar192._16_4_ = uVar103;
                        auVar192._20_4_ = uVar103;
                        auVar192._24_4_ = uVar103;
                        auVar192._28_4_ = uVar103;
                        auVar152 = vsubps_avx(auVar192,auVar82);
                        auVar28._4_4_ = (float)local_28a0._4_4_ * auVar152._4_4_;
                        auVar28._0_4_ = (float)local_28a0._0_4_ * auVar152._0_4_;
                        auVar28._8_4_ = fStack_2898 * auVar152._8_4_;
                        auVar28._12_4_ = fStack_2894 * auVar152._12_4_;
                        auVar28._16_4_ = fStack_2890 * auVar152._16_4_;
                        auVar28._20_4_ = fStack_288c * auVar152._20_4_;
                        auVar28._24_4_ = fStack_2888 * auVar152._24_4_;
                        auVar28._28_4_ = auVar152._28_4_;
                        auVar194 = ZEXT3264(auVar28);
                        uVar103 = *(undefined4 *)(local_2e00 + uVar91);
                        auVar199._4_4_ = uVar103;
                        auVar199._0_4_ = uVar103;
                        auVar199._8_4_ = uVar103;
                        auVar199._12_4_ = uVar103;
                        auVar199._16_4_ = uVar103;
                        auVar199._20_4_ = uVar103;
                        auVar199._24_4_ = uVar103;
                        auVar199._28_4_ = uVar103;
                        auVar152 = vsubps_avx(auVar199,auVar84);
                        auVar29._4_4_ = (float)local_2880._4_4_ * auVar152._4_4_;
                        auVar29._0_4_ = (float)local_2880._0_4_ * auVar152._0_4_;
                        auVar29._8_4_ = fStack_2878 * auVar152._8_4_;
                        auVar29._12_4_ = fStack_2874 * auVar152._12_4_;
                        auVar29._16_4_ = fStack_2870 * auVar152._16_4_;
                        auVar29._20_4_ = fStack_286c * auVar152._20_4_;
                        auVar29._24_4_ = fStack_2868 * auVar152._24_4_;
                        auVar29._28_4_ = auVar152._28_4_;
                        auVar203 = ZEXT3264(auVar29);
                        uVar103 = *(undefined4 *)(local_27c0 + uVar91);
                        auVar206._4_4_ = uVar103;
                        auVar206._0_4_ = uVar103;
                        auVar206._8_4_ = uVar103;
                        auVar206._12_4_ = uVar103;
                        auVar206._16_4_ = uVar103;
                        auVar206._20_4_ = uVar103;
                        auVar206._24_4_ = uVar103;
                        auVar206._28_4_ = uVar103;
                        auVar207 = ZEXT3264(auVar206);
                        auVar152 = vsubps_avx(auVar206,auVar80);
                        auVar30._4_4_ = (float)local_28c0._4_4_ * auVar152._4_4_;
                        auVar30._0_4_ = (float)local_28c0._0_4_ * auVar152._0_4_;
                        auVar30._8_4_ = fStack_28b8 * auVar152._8_4_;
                        auVar30._12_4_ = fStack_28b4 * auVar152._12_4_;
                        auVar30._16_4_ = fStack_28b0 * auVar152._16_4_;
                        auVar30._20_4_ = fStack_28ac * auVar152._20_4_;
                        auVar30._24_4_ = fStack_28a8 * auVar152._24_4_;
                        auVar30._28_4_ = auVar152._28_4_;
                        uVar103 = *(undefined4 *)((long)&local_2ff0.valid + uVar91);
                        auVar182._4_4_ = uVar103;
                        auVar182._0_4_ = uVar103;
                        auVar182._8_4_ = uVar103;
                        auVar182._12_4_ = uVar103;
                        auVar182._16_4_ = uVar103;
                        auVar182._20_4_ = uVar103;
                        auVar182._24_4_ = uVar103;
                        auVar182._28_4_ = uVar103;
                        auVar152 = vsubps_avx(auVar182,auVar82);
                        auVar31._4_4_ = (float)local_28a0._4_4_ * auVar152._4_4_;
                        auVar31._0_4_ = (float)local_28a0._0_4_ * auVar152._0_4_;
                        auVar31._8_4_ = fStack_2898 * auVar152._8_4_;
                        auVar31._12_4_ = fStack_2894 * auVar152._12_4_;
                        auVar31._16_4_ = fStack_2890 * auVar152._16_4_;
                        auVar31._20_4_ = fStack_288c * auVar152._20_4_;
                        auVar31._24_4_ = fStack_2888 * auVar152._24_4_;
                        auVar31._28_4_ = auVar152._28_4_;
                        uVar103 = *(undefined4 *)((long)&local_2ca0 + uVar91);
                        auVar183._4_4_ = uVar103;
                        auVar183._0_4_ = uVar103;
                        auVar183._8_4_ = uVar103;
                        auVar183._12_4_ = uVar103;
                        auVar183._16_4_ = uVar103;
                        auVar183._20_4_ = uVar103;
                        auVar183._24_4_ = uVar103;
                        auVar183._28_4_ = uVar103;
                        auVar152 = vsubps_avx(auVar183,auVar84);
                        auVar32._4_4_ = (float)local_2880._4_4_ * auVar152._4_4_;
                        auVar32._0_4_ = (float)local_2880._0_4_ * auVar152._0_4_;
                        auVar32._8_4_ = fStack_2878 * auVar152._8_4_;
                        auVar32._12_4_ = fStack_2874 * auVar152._12_4_;
                        auVar32._16_4_ = fStack_2870 * auVar152._16_4_;
                        auVar32._20_4_ = fStack_286c * auVar152._20_4_;
                        auVar32._24_4_ = fStack_2868 * auVar152._24_4_;
                        auVar32._28_4_ = auVar152._28_4_;
                        auVar152 = vminps_avx(auVar27,auVar30);
                        auVar132 = vminps_avx(auVar28,auVar31);
                        auVar152 = vmaxps_avx(auVar152,auVar132);
                        auVar132 = vminps_avx(auVar29,auVar32);
                        auVar152 = vmaxps_avx(auVar152,auVar132);
                        auVar33._4_4_ = auVar210._4_4_ * auVar152._4_4_;
                        auVar33._0_4_ = auVar210._0_4_ * auVar152._0_4_;
                        auVar33._8_4_ = auVar210._8_4_ * auVar152._8_4_;
                        auVar33._12_4_ = auVar210._12_4_ * auVar152._12_4_;
                        auVar33._16_4_ = auVar210._16_4_ * auVar152._16_4_;
                        auVar33._20_4_ = auVar210._20_4_ * auVar152._20_4_;
                        auVar33._24_4_ = auVar210._24_4_ * auVar152._24_4_;
                        auVar33._28_4_ = auVar152._28_4_;
                        auVar152 = vmaxps_avx(auVar27,auVar30);
                        auVar132 = vmaxps_avx(auVar28,auVar31);
                        auVar132 = vminps_avx(auVar152,auVar132);
                        auVar152 = vmaxps_avx(auVar29,auVar32);
                        auVar152 = vminps_avx(auVar132,auVar152);
                        auVar34._4_4_ = auVar211._4_4_ * auVar152._4_4_;
                        auVar34._0_4_ = auVar211._0_4_ * auVar152._0_4_;
                        auVar34._8_4_ = auVar211._8_4_ * auVar152._8_4_;
                        auVar34._12_4_ = auVar211._12_4_ * auVar152._12_4_;
                        auVar34._16_4_ = auVar211._16_4_ * auVar152._16_4_;
                        auVar34._20_4_ = auVar211._20_4_ * auVar152._20_4_;
                        auVar34._24_4_ = auVar211._24_4_ * auVar152._24_4_;
                        auVar34._28_4_ = auVar152._28_4_;
                        auVar152 = vmaxps_avx(auVar33,local_2800);
                        auVar161 = ZEXT3264(auVar152);
                        auVar132 = vminps_avx(auVar34,local_27e0);
                        auVar152 = vcmpps_avx(auVar152,auVar132,2);
                        auVar152 = auVar166 & auVar152;
                        if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar152 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar152 >> 0x7f,0) == '\0')
                              && (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar152 >> 0xbf,0) == '\0') &&
                            (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar152[0x1f]) {
                          bVar105 = false;
                        }
                        else {
                          local_2d68 = uVar97;
                          uVar3 = *(ushort *)(lVar93 + lVar25 * 8);
                          uVar4 = *(ushort *)(lVar93 + 2 + lVar25 * 8);
                          local_29f0 = *(uint *)(lVar93 + 0x50);
                          local_3020._0_8_ = CONCAT44(0,local_29f0);
                          local_2a00 = *(uint *)(lVar93 + 4 + lVar25 * 8);
                          local_2fc0._0_8_ = CONCAT44(0,local_2a00);
                          pGVar6 = (context->scene->geometries).items[CONCAT44(0,local_29f0)].ptr;
                          lVar25 = *(long *)&pGVar6->field_0x58;
                          lVar7 = *(long *)&pGVar6[1].time_range.upper;
                          lVar99 = CONCAT44(0,local_2a00) *
                                   pGVar6[1].super_RefCount.refCounter.
                                   super___atomic_base<unsigned_long>._M_i;
                          uVar92 = uVar3 & 0x7fff;
                          uVar90 = uVar4 & 0x7fff;
                          uVar89 = *(uint *)(lVar25 + 4 + lVar99);
                          uVar97 = (ulong)uVar89;
                          unaff_R14 = (undefined1  [8])
                                      (ulong)(uVar89 * uVar90 + *(int *)(lVar25 + lVar99) + uVar92);
                          p_Var8 = pGVar6[1].intersectionFilterN;
                          local_27b0 = *(undefined1 (*) [16])
                                        (lVar7 + ((long)unaff_R14 + 1U) * (long)p_Var8);
                          auVar161 = ZEXT1664(local_27b0);
                          lVar93 = (long)unaff_R14 + uVar97;
                          puVar96 = (undefined8 *)(lVar7 + lVar93 * (long)p_Var8);
                          local_2790 = *puVar96;
                          uStack_2788 = puVar96[1];
                          lVar100 = (long)unaff_R14 + uVar97 + 1;
                          puVar96 = (undefined8 *)(lVar7 + lVar100 * (long)p_Var8);
                          local_27a0 = *puVar96;
                          uStack_2798 = puVar96[1];
                          uVar98 = (ulong)(-1 < (short)uVar3);
                          local_2770 = *(undefined1 (*) [16])
                                        (lVar7 + ((long)unaff_R14 + uVar98 + 1) * (long)p_Var8);
                          auVar194 = ZEXT1664(local_2770);
                          lVar95 = uVar98 + lVar100;
                          puVar96 = (undefined8 *)(lVar7 + lVar95 * (long)p_Var8);
                          local_2760 = *puVar96;
                          uStack_2758 = puVar96[1];
                          if ((short)uVar4 < 0) {
                            uVar97 = 0;
                          }
                          puVar96 = (undefined8 *)(lVar7 + (lVar93 + uVar97) * (long)p_Var8);
                          local_2720 = *(undefined1 (*) [16])
                                        (lVar7 + (lVar100 + uVar97) * (long)p_Var8);
                          auVar203 = ZEXT1664(local_2720);
                          puVar2 = (undefined8 *)(lVar7 + (uVar97 + lVar95) * (long)p_Var8);
                          local_27c0 = *(undefined1 (*) [16])
                                        (lVar7 + (long)p_Var8 * (long)unaff_R14);
                          local_2780 = local_27b0;
                          local_2750 = local_27a0;
                          uStack_2748 = uStack_2798;
                          local_2740 = local_2790;
                          uStack_2738 = uStack_2788;
                          local_2730 = local_27a0;
                          uStack_2728 = uStack_2798;
                          local_2710 = *puVar96;
                          uStack_2708 = puVar96[1];
                          local_2700 = local_27a0;
                          uStack_26f8 = uStack_2798;
                          local_26f0 = local_2760;
                          uStack_26e8 = uStack_2758;
                          local_26e0 = *puVar2;
                          uStack_26d8 = puVar2[1];
                          local_26d0 = local_2720;
                          auVar223 = ZEXT3264(auVar166);
                          uStack_29ec = local_29f0;
                          uStack_29e8 = local_29f0;
                          uStack_29e4 = local_29f0;
                          uStack_29fc = local_2a00;
                          uStack_29f8 = local_2a00;
                          uStack_29f4 = local_2a00;
                          puVar96 = &uStack_2788;
                          auVar94 = (undefined1  [8])0x0;
                          auVar205 = ZEXT3264(auVar166);
                          do {
                            auVar166 = auVar205._0_32_;
                            auVar132 = auVar223._0_32_;
                            auVar152 = in_ZMM14._0_32_;
                            auVar181 = in_ZMM13._0_32_;
                            if (auVar94 == (undefined1  [8])0x4) {
                              auVar207 = ZEXT3264(auVar181);
                              break;
                            }
                            local_2f00 = auVar152;
                            local_2ee0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)auVar181;
                            uVar103 = *(undefined4 *)(puVar96 + -7);
                            auVar125._4_4_ = uVar103;
                            auVar125._0_4_ = uVar103;
                            auVar125._8_4_ = uVar103;
                            auVar125._12_4_ = uVar103;
                            auVar125._16_4_ = uVar103;
                            auVar125._20_4_ = uVar103;
                            auVar125._24_4_ = uVar103;
                            auVar125._28_4_ = uVar103;
                            uVar103 = *(undefined4 *)((long)puVar96 + -0x34);
                            auVar153._4_4_ = uVar103;
                            auVar153._0_4_ = uVar103;
                            auVar153._8_4_ = uVar103;
                            auVar153._12_4_ = uVar103;
                            auVar153._16_4_ = uVar103;
                            auVar153._20_4_ = uVar103;
                            auVar153._24_4_ = uVar103;
                            auVar153._28_4_ = uVar103;
                            uVar103 = *(undefined4 *)(puVar96 + -6);
                            auVar167._4_4_ = uVar103;
                            auVar167._0_4_ = uVar103;
                            auVar167._8_4_ = uVar103;
                            auVar167._12_4_ = uVar103;
                            auVar167._16_4_ = uVar103;
                            auVar167._20_4_ = uVar103;
                            auVar167._24_4_ = uVar103;
                            auVar167._28_4_ = uVar103;
                            uVar103 = *(undefined4 *)(puVar96 + -1);
                            local_2aa0._4_4_ = uVar103;
                            local_2aa0._0_4_ = uVar103;
                            local_2aa0._8_4_ = uVar103;
                            local_2aa0._12_4_ = uVar103;
                            local_2aa0._16_4_ = uVar103;
                            local_2aa0._20_4_ = uVar103;
                            local_2aa0._24_4_ = uVar103;
                            local_2aa0._28_4_ = uVar103;
                            uVar103 = *(undefined4 *)((long)puVar96 + -4);
                            local_2ac0._4_4_ = uVar103;
                            local_2ac0._0_4_ = uVar103;
                            local_2ac0._8_4_ = uVar103;
                            local_2ac0._12_4_ = uVar103;
                            local_2ac0._16_4_ = uVar103;
                            local_2ac0._20_4_ = uVar103;
                            local_2ac0._24_4_ = uVar103;
                            local_2ac0._28_4_ = uVar103;
                            uVar103 = *(undefined4 *)puVar96;
                            local_2ae0._4_4_ = uVar103;
                            local_2ae0._0_4_ = uVar103;
                            local_2ae0._8_4_ = uVar103;
                            local_2ae0._12_4_ = uVar103;
                            local_2ae0._16_4_ = uVar103;
                            local_2ae0._20_4_ = uVar103;
                            local_2ae0._24_4_ = uVar103;
                            local_2ae0._28_4_ = uVar103;
                            local_2c70 = CONCAT44(uStack_29ec,local_29f0);
                            uStack_2c68 = CONCAT44(uStack_29e4,uStack_29e8);
                            local_2c80 = CONCAT44(uStack_29fc,local_2a00);
                            uStack_2c78 = CONCAT44(uStack_29f4,uStack_29f8);
                            auVar132 = *(undefined1 (*) [32])ray;
                            auVar186 = *(undefined1 (*) [32])(ray + 0x20);
                            local_2f40 = *(undefined1 (*) [32])(ray + 0x40);
                            local_2e20 = vsubps_avx(auVar125,auVar132);
                            _local_2fa0 = vsubps_avx(auVar153,auVar186);
                            _local_2f20 = vsubps_avx(auVar167,local_2f40);
                            auVar191 = vsubps_avx(local_2ac0,auVar186);
                            local_2fc0 = vsubps_avx(local_2ae0,local_2f40);
                            local_2ec0 = vsubps_avx(auVar191,_local_2fa0);
                            local_2ea0 = vsubps_avx(local_2fc0,_local_2f20);
                            auVar197._0_4_ = auVar191._0_4_ + local_2fa0._0_4_;
                            auVar197._4_4_ = auVar191._4_4_ + local_2fa0._4_4_;
                            auVar197._8_4_ = auVar191._8_4_ + local_2fa0._8_4_;
                            auVar197._12_4_ = auVar191._12_4_ + local_2fa0._12_4_;
                            auVar197._16_4_ = auVar191._16_4_ + local_2fa0._16_4_;
                            auVar197._20_4_ = auVar191._20_4_ + local_2fa0._20_4_;
                            auVar197._24_4_ = auVar191._24_4_ + local_2fa0._24_4_;
                            auVar197._28_4_ = auVar191._28_4_ + local_2fa0._28_4_;
                            fVar109 = local_2f20._0_4_;
                            auVar200._0_4_ = local_2fc0._0_4_ + fVar109;
                            fVar108 = local_2f20._4_4_;
                            auVar200._4_4_ = local_2fc0._4_4_ + fVar108;
                            fVar140 = local_2f20._8_4_;
                            auVar200._8_4_ = local_2fc0._8_4_ + fVar140;
                            fVar143 = local_2f20._12_4_;
                            auVar200._12_4_ = local_2fc0._12_4_ + fVar143;
                            fVar195 = local_2f20._16_4_;
                            auVar200._16_4_ = local_2fc0._16_4_ + fVar195;
                            fVar196 = local_2f20._20_4_;
                            auVar200._20_4_ = local_2fc0._20_4_ + fVar196;
                            fVar10 = local_2f20._24_4_;
                            fVar106 = local_2fc0._28_4_;
                            auVar200._24_4_ = local_2fc0._24_4_ + fVar10;
                            fVar107 = local_2f20._28_4_;
                            auVar200._28_4_ = fVar106 + fVar107;
                            auVar203._0_4_ = auVar197._0_4_ * local_2ea0._0_4_;
                            auVar203._4_4_ = auVar197._4_4_ * local_2ea0._4_4_;
                            auVar203._8_4_ = auVar197._8_4_ * local_2ea0._8_4_;
                            auVar203._12_4_ = auVar197._12_4_ * local_2ea0._12_4_;
                            auVar203._16_4_ = auVar197._16_4_ * local_2ea0._16_4_;
                            auVar203._20_4_ = auVar197._20_4_ * local_2ea0._20_4_;
                            auVar203._28_36_ = in_ZMM14._28_36_;
                            auVar203._24_4_ = auVar197._24_4_ * local_2ea0._24_4_;
                            auVar147 = vfmsub231ps_fma(auVar203._0_32_,local_2ec0,auVar200);
                            auVar129 = vsubps_avx(local_2aa0,auVar132);
                            local_2de0 = vsubps_avx(auVar129,local_2e20);
                            auVar194._0_4_ = auVar200._0_4_ * local_2de0._0_4_;
                            auVar194._4_4_ = auVar200._4_4_ * local_2de0._4_4_;
                            auVar194._8_4_ = auVar200._8_4_ * local_2de0._8_4_;
                            auVar194._12_4_ = auVar200._12_4_ * local_2de0._12_4_;
                            auVar194._16_4_ = auVar200._16_4_ * local_2de0._16_4_;
                            auVar194._20_4_ = auVar200._20_4_ * local_2de0._20_4_;
                            auVar194._28_36_ = auVar205._28_36_;
                            auVar194._24_4_ = auVar200._24_4_ * local_2de0._24_4_;
                            auVar201._0_4_ = auVar129._0_4_ + local_2e20._0_4_;
                            auVar201._4_4_ = auVar129._4_4_ + local_2e20._4_4_;
                            auVar201._8_4_ = auVar129._8_4_ + local_2e20._8_4_;
                            auVar201._12_4_ = auVar129._12_4_ + local_2e20._12_4_;
                            auVar201._16_4_ = auVar129._16_4_ + local_2e20._16_4_;
                            auVar201._20_4_ = auVar129._20_4_ + local_2e20._20_4_;
                            auVar201._24_4_ = auVar129._24_4_ + local_2e20._24_4_;
                            auVar201._28_4_ = auVar129._28_4_ + local_2e20._28_4_;
                            auVar110 = vfmsub231ps_fma(auVar194._0_32_,local_2ea0,auVar201);
                            auVar35._4_4_ = auVar201._4_4_ * local_2ec0._4_4_;
                            auVar35._0_4_ = auVar201._0_4_ * local_2ec0._0_4_;
                            auVar35._8_4_ = auVar201._8_4_ * local_2ec0._8_4_;
                            auVar35._12_4_ = auVar201._12_4_ * local_2ec0._12_4_;
                            auVar35._16_4_ = auVar201._16_4_ * local_2ec0._16_4_;
                            auVar35._20_4_ = auVar201._20_4_ * local_2ec0._20_4_;
                            auVar35._24_4_ = auVar201._24_4_ * local_2ec0._24_4_;
                            auVar35._28_4_ = local_2ec0._28_4_;
                            auVar111 = vfmsub231ps_fma(auVar35,local_2de0,auVar197);
                            pRVar1 = ray + 0xc0;
                            fVar136 = *(float *)pRVar1;
                            fVar138 = *(float *)(ray + 0xc4);
                            fVar141 = *(float *)(ray + 200);
                            fVar144 = *(float *)(ray + 0xcc);
                            fVar145 = *(float *)(ray + 0xd0);
                            fVar146 = *(float *)(ray + 0xd4);
                            fVar78 = *(float *)(ray + 0xd8);
                            auVar87 = *(undefined1 (*) [28])pRVar1;
                            auVar36._4_4_ = fVar138 * auVar111._4_4_;
                            auVar36._0_4_ = fVar136 * auVar111._0_4_;
                            auVar36._8_4_ = fVar141 * auVar111._8_4_;
                            auVar36._12_4_ = fVar144 * auVar111._12_4_;
                            auVar36._16_4_ = fVar145 * 0.0;
                            auVar36._20_4_ = fVar146 * 0.0;
                            auVar36._24_4_ = fVar78 * 0.0;
                            auVar36._28_4_ = local_2de0._28_4_;
                            auVar128 = *(undefined1 (*) [32])(ray + 0xa0);
                            auVar110 = vfmadd231ps_fma(auVar36,auVar128,ZEXT1632(auVar110));
                            uVar103 = *(undefined4 *)(puVar96 + -5);
                            local_2b00._4_4_ = uVar103;
                            local_2b00._0_4_ = uVar103;
                            local_2b00._8_4_ = uVar103;
                            local_2b00._12_4_ = uVar103;
                            local_2b00._16_4_ = uVar103;
                            local_2b00._20_4_ = uVar103;
                            local_2b00._24_4_ = uVar103;
                            local_2b00._28_4_ = uVar103;
                            local_2cc0 = *(undefined1 (*) [32])(ray + 0x80);
                            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),local_2cc0,
                                                       ZEXT1632(auVar147));
                            auVar132 = vsubps_avx(local_2b00,auVar132);
                            uVar103 = *(undefined4 *)((long)puVar96 + -0x24);
                            local_2b20._4_4_ = uVar103;
                            local_2b20._0_4_ = uVar103;
                            local_2b20._8_4_ = uVar103;
                            local_2b20._12_4_ = uVar103;
                            local_2b20._16_4_ = uVar103;
                            local_2b20._20_4_ = uVar103;
                            local_2b20._24_4_ = uVar103;
                            local_2b20._28_4_ = uVar103;
                            auVar186 = vsubps_avx(local_2b20,auVar186);
                            uVar103 = *(undefined4 *)(puVar96 + -4);
                            local_2640._4_4_ = uVar103;
                            local_2640._0_4_ = uVar103;
                            local_2640._8_4_ = uVar103;
                            local_2640._12_4_ = uVar103;
                            local_2640._16_4_ = uVar103;
                            local_2640._20_4_ = uVar103;
                            local_2640._24_4_ = uVar103;
                            local_2640._28_4_ = uVar103;
                            auVar176 = vsubps_avx(local_2640,local_2f40);
                            local_2a60 = vsubps_avx(_local_2fa0,auVar186);
                            auVar127 = vsubps_avx(_local_2f20,auVar176);
                            auVar220._0_4_ = local_2fa0._0_4_ + auVar186._0_4_;
                            auVar220._4_4_ = local_2fa0._4_4_ + auVar186._4_4_;
                            auVar220._8_4_ = local_2fa0._8_4_ + auVar186._8_4_;
                            auVar220._12_4_ = local_2fa0._12_4_ + auVar186._12_4_;
                            auVar220._16_4_ = local_2fa0._16_4_ + auVar186._16_4_;
                            auVar220._20_4_ = local_2fa0._20_4_ + auVar186._20_4_;
                            auVar220._24_4_ = local_2fa0._24_4_ + auVar186._24_4_;
                            auVar220._28_4_ = local_2fa0._28_4_ + auVar186._28_4_;
                            auVar154._0_4_ = fVar109 + auVar176._0_4_;
                            auVar154._4_4_ = fVar108 + auVar176._4_4_;
                            auVar154._8_4_ = fVar140 + auVar176._8_4_;
                            auVar154._12_4_ = fVar143 + auVar176._12_4_;
                            auVar154._16_4_ = fVar195 + auVar176._16_4_;
                            auVar154._20_4_ = fVar196 + auVar176._20_4_;
                            auVar154._24_4_ = fVar10 + auVar176._24_4_;
                            auVar154._28_4_ = fVar107 + auVar176._28_4_;
                            fVar137 = auVar127._0_4_;
                            fVar139 = auVar127._4_4_;
                            auVar37._4_4_ = auVar220._4_4_ * fVar139;
                            auVar37._0_4_ = auVar220._0_4_ * fVar137;
                            fVar11 = auVar127._8_4_;
                            auVar37._8_4_ = auVar220._8_4_ * fVar11;
                            fVar13 = auVar127._12_4_;
                            auVar37._12_4_ = auVar220._12_4_ * fVar13;
                            fVar15 = auVar127._16_4_;
                            auVar37._16_4_ = auVar220._16_4_ * fVar15;
                            fVar17 = auVar127._20_4_;
                            auVar37._20_4_ = auVar220._20_4_ * fVar17;
                            fVar19 = auVar127._24_4_;
                            auVar37._24_4_ = auVar220._24_4_ * fVar19;
                            auVar37._28_4_ = fVar107;
                            auVar111 = vfmsub231ps_fma(auVar37,local_2a60,auVar154);
                            auVar21 = vsubps_avx(local_2e20,auVar132);
                            fVar212 = auVar21._0_4_;
                            fVar213 = auVar21._4_4_;
                            auVar38._4_4_ = fVar213 * auVar154._4_4_;
                            auVar38._0_4_ = fVar212 * auVar154._0_4_;
                            fVar215 = auVar21._8_4_;
                            auVar38._8_4_ = fVar215 * auVar154._8_4_;
                            fVar216 = auVar21._12_4_;
                            auVar38._12_4_ = fVar216 * auVar154._12_4_;
                            fVar217 = auVar21._16_4_;
                            auVar38._16_4_ = fVar217 * auVar154._16_4_;
                            fVar218 = auVar21._20_4_;
                            auVar38._20_4_ = fVar218 * auVar154._20_4_;
                            fVar219 = auVar21._24_4_;
                            auVar38._24_4_ = fVar219 * auVar154._24_4_;
                            auVar38._28_4_ = auVar154._28_4_;
                            auVar184._0_4_ = local_2e20._0_4_ + auVar132._0_4_;
                            auVar184._4_4_ = local_2e20._4_4_ + auVar132._4_4_;
                            auVar184._8_4_ = local_2e20._8_4_ + auVar132._8_4_;
                            auVar184._12_4_ = local_2e20._12_4_ + auVar132._12_4_;
                            auVar184._16_4_ = local_2e20._16_4_ + auVar132._16_4_;
                            auVar184._20_4_ = local_2e20._20_4_ + auVar132._20_4_;
                            auVar184._24_4_ = local_2e20._24_4_ + auVar132._24_4_;
                            auVar184._28_4_ = local_2e20._28_4_ + auVar132._28_4_;
                            auVar147 = vfmsub231ps_fma(auVar38,auVar127,auVar184);
                            fVar107 = local_2a60._0_4_;
                            fVar142 = local_2a60._4_4_;
                            auVar39._4_4_ = auVar184._4_4_ * fVar142;
                            auVar39._0_4_ = auVar184._0_4_ * fVar107;
                            fVar12 = local_2a60._8_4_;
                            auVar39._8_4_ = auVar184._8_4_ * fVar12;
                            fVar14 = local_2a60._12_4_;
                            auVar39._12_4_ = auVar184._12_4_ * fVar14;
                            fVar16 = local_2a60._16_4_;
                            auVar39._16_4_ = auVar184._16_4_ * fVar16;
                            fVar18 = local_2a60._20_4_;
                            auVar39._20_4_ = auVar184._20_4_ * fVar18;
                            fVar20 = local_2a60._24_4_;
                            auVar39._24_4_ = auVar184._24_4_ * fVar20;
                            auVar39._28_4_ = auVar184._28_4_;
                            auVar112 = vfmsub231ps_fma(auVar39,auVar21,auVar220);
                            auVar185._0_4_ = fVar136 * auVar112._0_4_;
                            auVar185._4_4_ = fVar138 * auVar112._4_4_;
                            auVar185._8_4_ = fVar141 * auVar112._8_4_;
                            auVar185._12_4_ = fVar144 * auVar112._12_4_;
                            auVar185._16_4_ = fVar145 * 0.0;
                            auVar185._20_4_ = fVar146 * 0.0;
                            auVar185._24_4_ = fVar78 * 0.0;
                            auVar185._28_4_ = 0;
                            auVar147 = vfmadd231ps_fma(auVar185,auVar128,ZEXT1632(auVar147));
                            auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),local_2cc0,
                                                       ZEXT1632(auVar111));
                            auVar22 = vsubps_avx(auVar132,auVar129);
                            auVar155._0_4_ = auVar129._0_4_ + auVar132._0_4_;
                            auVar155._4_4_ = auVar129._4_4_ + auVar132._4_4_;
                            auVar155._8_4_ = auVar129._8_4_ + auVar132._8_4_;
                            auVar155._12_4_ = auVar129._12_4_ + auVar132._12_4_;
                            auVar155._16_4_ = auVar129._16_4_ + auVar132._16_4_;
                            auVar155._20_4_ = auVar129._20_4_ + auVar132._20_4_;
                            auVar155._24_4_ = auVar129._24_4_ + auVar132._24_4_;
                            auVar155._28_4_ = auVar129._28_4_ + auVar132._28_4_;
                            auVar23 = vsubps_avx(auVar186,auVar191);
                            auVar168._0_4_ = auVar191._0_4_ + auVar186._0_4_;
                            auVar168._4_4_ = auVar191._4_4_ + auVar186._4_4_;
                            auVar168._8_4_ = auVar191._8_4_ + auVar186._8_4_;
                            auVar168._12_4_ = auVar191._12_4_ + auVar186._12_4_;
                            auVar168._16_4_ = auVar191._16_4_ + auVar186._16_4_;
                            auVar168._20_4_ = auVar191._20_4_ + auVar186._20_4_;
                            auVar168._24_4_ = auVar191._24_4_ + auVar186._24_4_;
                            auVar168._28_4_ = auVar191._28_4_ + auVar186._28_4_;
                            auVar24 = vsubps_avx(auVar176,local_2fc0);
                            auVar126._0_4_ = auVar176._0_4_ + local_2fc0._0_4_;
                            auVar126._4_4_ = auVar176._4_4_ + local_2fc0._4_4_;
                            auVar126._8_4_ = auVar176._8_4_ + local_2fc0._8_4_;
                            auVar126._12_4_ = auVar176._12_4_ + local_2fc0._12_4_;
                            auVar126._16_4_ = auVar176._16_4_ + local_2fc0._16_4_;
                            auVar126._20_4_ = auVar176._20_4_ + local_2fc0._20_4_;
                            auVar126._24_4_ = auVar176._24_4_ + local_2fc0._24_4_;
                            auVar126._28_4_ = auVar176._28_4_ + fVar106;
                            auVar40._4_4_ = auVar24._4_4_ * auVar168._4_4_;
                            auVar40._0_4_ = auVar24._0_4_ * auVar168._0_4_;
                            auVar40._8_4_ = auVar24._8_4_ * auVar168._8_4_;
                            auVar40._12_4_ = auVar24._12_4_ * auVar168._12_4_;
                            auVar40._16_4_ = auVar24._16_4_ * auVar168._16_4_;
                            auVar40._20_4_ = auVar24._20_4_ * auVar168._20_4_;
                            auVar40._24_4_ = auVar24._24_4_ * auVar168._24_4_;
                            auVar40._28_4_ = fVar106;
                            auVar112 = vfmsub231ps_fma(auVar40,auVar23,auVar126);
                            auVar41._4_4_ = auVar22._4_4_ * auVar126._4_4_;
                            auVar41._0_4_ = auVar22._0_4_ * auVar126._0_4_;
                            auVar41._8_4_ = auVar22._8_4_ * auVar126._8_4_;
                            auVar41._12_4_ = auVar22._12_4_ * auVar126._12_4_;
                            auVar41._16_4_ = auVar22._16_4_ * auVar126._16_4_;
                            auVar41._20_4_ = auVar22._20_4_ * auVar126._20_4_;
                            auVar41._24_4_ = auVar22._24_4_ * auVar126._24_4_;
                            auVar41._28_4_ = auVar126._28_4_;
                            auVar111 = vfmsub231ps_fma(auVar41,auVar24,auVar155);
                            auVar42._4_4_ = auVar23._4_4_ * auVar155._4_4_;
                            auVar42._0_4_ = auVar23._0_4_ * auVar155._0_4_;
                            auVar42._8_4_ = auVar23._8_4_ * auVar155._8_4_;
                            auVar42._12_4_ = auVar23._12_4_ * auVar155._12_4_;
                            auVar42._16_4_ = auVar23._16_4_ * auVar155._16_4_;
                            auVar42._20_4_ = auVar23._20_4_ * auVar155._20_4_;
                            auVar42._24_4_ = auVar23._24_4_ * auVar155._24_4_;
                            auVar42._28_4_ = auVar155._28_4_;
                            auVar113 = vfmsub231ps_fma(auVar42,auVar22,auVar168);
                            _local_2d00 = *(undefined1 (*) [32])pRVar1;
                            auVar26 = _local_2d00;
                            auVar156._0_4_ = fVar136 * auVar113._0_4_;
                            auVar156._4_4_ = fVar138 * auVar113._4_4_;
                            auVar156._8_4_ = fVar141 * auVar113._8_4_;
                            auVar156._12_4_ = fVar144 * auVar113._12_4_;
                            auVar156._16_4_ = fVar145 * 0.0;
                            auVar156._20_4_ = fVar146 * 0.0;
                            auVar156._24_4_ = fVar78 * 0.0;
                            auVar156._28_4_ = 0;
                            auVar111 = vfmadd231ps_fma(auVar156,auVar128,ZEXT1632(auVar111));
                            auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),local_2cc0,
                                                       ZEXT1632(auVar112));
                            _local_2e80 = ZEXT1632(CONCAT412(auVar111._12_4_ +
                                                             auVar110._12_4_ + auVar147._12_4_,
                                                             CONCAT48(auVar111._8_4_ +
                                                                      auVar110._8_4_ +
                                                                      auVar147._8_4_,
                                                                      CONCAT44(auVar111._4_4_ +
                                                                               auVar110._4_4_ +
                                                                               auVar147._4_4_,
                                                                               auVar111._0_4_ +
                                                                               auVar110._0_4_ +
                                                                               auVar147._0_4_))));
                            auVar186 = vandps_avx(_local_2e80,local_2a80);
                            fVar106 = auVar186._0_4_ * 1.1920929e-07;
                            fVar136 = auVar186._4_4_ * 1.1920929e-07;
                            auVar43._4_4_ = fVar136;
                            auVar43._0_4_ = fVar106;
                            fVar138 = auVar186._8_4_ * 1.1920929e-07;
                            auVar43._8_4_ = fVar138;
                            fVar141 = auVar186._12_4_ * 1.1920929e-07;
                            auVar43._12_4_ = fVar141;
                            fVar144 = auVar186._16_4_ * 1.1920929e-07;
                            auVar43._16_4_ = fVar144;
                            fVar145 = auVar186._20_4_ * 1.1920929e-07;
                            auVar43._20_4_ = fVar145;
                            fVar146 = auVar186._24_4_ * 1.1920929e-07;
                            auVar43._24_4_ = fVar146;
                            auVar43._28_4_ = auVar186._28_4_;
                            auVar132 = ZEXT1632(auVar110);
                            auVar191 = vminps_avx(auVar132,ZEXT1632(auVar147));
                            auVar191 = vminps_avx(auVar191,ZEXT1632(auVar111));
                            auVar202._8_4_ = 0x80000000;
                            auVar202._0_8_ = 0x8000000080000000;
                            auVar202._12_4_ = 0x80000000;
                            auVar202._16_4_ = 0x80000000;
                            auVar202._20_4_ = 0x80000000;
                            auVar202._24_4_ = 0x80000000;
                            auVar202._28_4_ = 0x80000000;
                            auVar175._0_8_ = CONCAT44(fVar136,fVar106) ^ 0x8000000080000000;
                            auVar175._8_4_ = -fVar138;
                            auVar175._12_4_ = -fVar141;
                            auVar175._16_4_ = -fVar144;
                            auVar175._20_4_ = -fVar145;
                            auVar175._24_4_ = -fVar146;
                            auVar175._28_4_ = auVar186._28_4_ ^ 0x80000000;
                            auVar191 = vcmpps_avx(auVar191,auVar175,5);
                            local_2fc0 = auVar132;
                            auVar186 = ZEXT1632(auVar147);
                            local_2f40 = auVar186;
                            auVar176 = vmaxps_avx(auVar132,auVar186);
                            auVar129 = vmaxps_avx(auVar176,ZEXT1632(auVar111));
                            auVar129 = vcmpps_avx(auVar129,auVar43,2);
                            auVar191 = vorps_avx(auVar191,auVar129);
                            auVar129 = auVar166 & auVar191;
                            auVar191 = vandps_avx(auVar191,auVar166);
                            local_2660 = *(undefined4 *)(puVar96 + -3);
                            uVar103 = *(undefined4 *)((long)puVar96 + -0x14);
                            local_2680._4_4_ = uVar103;
                            local_2680._0_4_ = uVar103;
                            local_2680._8_4_ = uVar103;
                            local_2680._12_4_ = uVar103;
                            local_2680._16_4_ = uVar103;
                            local_2680._20_4_ = uVar103;
                            local_2680._24_4_ = uVar103;
                            local_2680._28_4_ = uVar103;
                            auVar161 = ZEXT3264(local_2680);
                            local_26a0 = *(undefined4 *)(puVar96 + -2);
                            uStack_265c = local_2660;
                            uStack_2658 = local_2660;
                            uStack_2654 = local_2660;
                            uStack_2650 = local_2660;
                            uStack_264c = local_2660;
                            uStack_2648 = local_2660;
                            uStack_2644 = local_2660;
                            uStack_269c = local_26a0;
                            uStack_2698 = local_26a0;
                            uStack_2694 = local_26a0;
                            uStack_2690 = local_26a0;
                            uStack_268c = local_26a0;
                            uStack_2688 = local_26a0;
                            uStack_2684 = local_26a0;
                            if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar129 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar129 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar129 >> 0x7f,0) == '\0') &&
                                  (auVar129 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar129 >> 0xbf,0) == '\0') &&
                                (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar129[0x1f]) {
LAB_015dac24:
                              _local_2e80 = local_2dc0;
                              auVar176 = local_2d60;
                              auVar186 = auVar152;
                              local_2f00 = (undefined1  [32])local_2f60;
                              auVar132 = auVar181;
                              local_2ee0 = local_2d40;
                              aVar222 = local_2d20;
                            }
                            else {
                              auVar44._4_4_ = fVar142 * local_2ea0._4_4_;
                              auVar44._0_4_ = fVar107 * local_2ea0._0_4_;
                              auVar44._8_4_ = fVar12 * local_2ea0._8_4_;
                              auVar44._12_4_ = fVar14 * local_2ea0._12_4_;
                              auVar44._16_4_ = fVar16 * local_2ea0._16_4_;
                              auVar44._20_4_ = fVar18 * local_2ea0._20_4_;
                              auVar44._24_4_ = fVar20 * local_2ea0._24_4_;
                              auVar44._28_4_ = local_2660;
                              auVar45._4_4_ = fVar213 * local_2ec0._4_4_;
                              auVar45._0_4_ = fVar212 * local_2ec0._0_4_;
                              auVar45._8_4_ = fVar215 * local_2ec0._8_4_;
                              auVar45._12_4_ = fVar216 * local_2ec0._12_4_;
                              auVar45._16_4_ = fVar217 * local_2ec0._16_4_;
                              auVar45._20_4_ = fVar218 * local_2ec0._20_4_;
                              auVar45._24_4_ = fVar219 * local_2ec0._24_4_;
                              auVar45._28_4_ = uVar103;
                              auVar110 = vfmsub213ps_fma(local_2ec0,auVar127,auVar44);
                              auVar46._4_4_ = auVar23._4_4_ * fVar139;
                              auVar46._0_4_ = auVar23._0_4_ * fVar137;
                              auVar46._8_4_ = auVar23._8_4_ * fVar11;
                              auVar46._12_4_ = auVar23._12_4_ * fVar13;
                              auVar46._16_4_ = auVar23._16_4_ * fVar15;
                              auVar46._20_4_ = auVar23._20_4_ * fVar17;
                              auVar46._24_4_ = auVar23._24_4_ * fVar19;
                              auVar46._28_4_ = local_26a0;
                              auVar47._4_4_ = fVar213 * auVar24._4_4_;
                              auVar47._0_4_ = fVar212 * auVar24._0_4_;
                              auVar47._8_4_ = fVar215 * auVar24._8_4_;
                              auVar47._12_4_ = fVar216 * auVar24._12_4_;
                              auVar47._16_4_ = fVar217 * auVar24._16_4_;
                              auVar47._20_4_ = fVar218 * auVar24._20_4_;
                              auVar47._24_4_ = fVar219 * auVar24._24_4_;
                              auVar47._28_4_ = auVar176._28_4_;
                              auVar147 = vfmsub213ps_fma(auVar24,local_2a60,auVar46);
                              auVar129 = vandps_avx(auVar44,local_2a80);
                              auVar176 = vandps_avx(auVar46,local_2a80);
                              auVar129 = vcmpps_avx(auVar129,auVar176,1);
                              aVar222 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                        vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar110),auVar129
                                                     );
                              auVar48._4_4_ = auVar22._4_4_ * fVar142;
                              auVar48._0_4_ = auVar22._0_4_ * fVar107;
                              auVar48._8_4_ = auVar22._8_4_ * fVar12;
                              auVar48._12_4_ = auVar22._12_4_ * fVar14;
                              auVar48._16_4_ = auVar22._16_4_ * fVar16;
                              auVar48._20_4_ = auVar22._20_4_ * fVar18;
                              auVar48._24_4_ = auVar22._24_4_ * fVar20;
                              auVar48._28_4_ = auVar129._28_4_;
                              auVar110 = vfmsub213ps_fma(auVar22,auVar127,auVar47);
                              auVar49._4_4_ = fVar139 * local_2de0._4_4_;
                              auVar49._0_4_ = fVar137 * local_2de0._0_4_;
                              auVar49._8_4_ = fVar11 * local_2de0._8_4_;
                              auVar49._12_4_ = fVar13 * local_2de0._12_4_;
                              auVar49._16_4_ = fVar15 * local_2de0._16_4_;
                              auVar49._20_4_ = fVar17 * local_2de0._20_4_;
                              auVar49._24_4_ = fVar19 * local_2de0._24_4_;
                              auVar49._28_4_ = auVar176._28_4_;
                              auVar147 = vfmsub213ps_fma(local_2ea0,auVar21,auVar49);
                              auVar129 = vandps_avx(auVar49,local_2a80);
                              auVar176 = vandps_avx(auVar47,local_2a80);
                              auVar129 = vcmpps_avx(auVar129,auVar176,1);
                              local_2ee0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                           vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar147),
                                                         auVar129);
                              auVar110 = vfmsub213ps_fma(local_2de0,local_2a60,auVar45);
                              auVar147 = vfmsub213ps_fma(auVar23,auVar21,auVar48);
                              auVar129 = vandps_avx(auVar45,local_2a80);
                              auVar176 = vandps_avx(auVar48,local_2a80);
                              auVar176 = vcmpps_avx(auVar129,auVar176,1);
                              local_2f00 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar110),
                                                         auVar176);
                              local_2d00._0_4_ = auVar87._0_4_;
                              local_2d00._4_4_ = auVar87._4_4_;
                              auStack_2cf8._0_4_ = auVar87._8_4_;
                              auStack_2cf8._4_4_ = auVar87._12_4_;
                              fStack_2cf0 = auVar87._16_4_;
                              fStack_2cec = auVar87._20_4_;
                              fStack_2ce8 = auVar87._24_4_;
                              auVar50._4_4_ = local_2f00._4_4_ * (float)local_2d00._4_4_;
                              auVar50._0_4_ = local_2f00._0_4_ * (float)local_2d00._0_4_;
                              auVar50._8_4_ = local_2f00._8_4_ * (float)auStack_2cf8._0_4_;
                              auVar50._12_4_ = local_2f00._12_4_ * (float)auStack_2cf8._4_4_;
                              auVar50._16_4_ = local_2f00._16_4_ * fStack_2cf0;
                              auVar50._20_4_ = local_2f00._20_4_ * fStack_2cec;
                              auVar50._24_4_ = local_2f00._24_4_ * fStack_2ce8;
                              auVar50._28_4_ = auVar176._28_4_;
                              auVar110 = vfmadd213ps_fma(auVar128,(undefined1  [32])local_2ee0,
                                                         auVar50);
                              auVar110 = vfmadd213ps_fma(local_2cc0,(undefined1  [32])aVar222,
                                                         ZEXT1632(auVar110));
                              fVar107 = auVar110._0_4_ + auVar110._0_4_;
                              fVar137 = auVar110._4_4_ + auVar110._4_4_;
                              fVar139 = auVar110._8_4_ + auVar110._8_4_;
                              fVar142 = auVar110._12_4_ + auVar110._12_4_;
                              auVar127 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar139,CONCAT44(
                                                  fVar137,fVar107))));
                              auVar51._4_4_ = local_2f00._4_4_ * fVar108;
                              auVar51._0_4_ = local_2f00._0_4_ * fVar109;
                              auVar51._8_4_ = local_2f00._8_4_ * fVar140;
                              auVar51._12_4_ = local_2f00._12_4_ * fVar143;
                              auVar51._16_4_ = local_2f00._16_4_ * fVar195;
                              auVar51._20_4_ = local_2f00._20_4_ * fVar196;
                              auVar51._24_4_ = local_2f00._24_4_ * fVar10;
                              auVar51._28_4_ = auVar129._28_4_;
                              auVar110 = vfmadd213ps_fma(_local_2fa0,(undefined1  [32])local_2ee0,
                                                         auVar51);
                              auVar147 = vfmadd213ps_fma(local_2e20,(undefined1  [32])aVar222,
                                                         ZEXT1632(auVar110));
                              auVar128 = vrcpps_avx(auVar127);
                              auVar187._8_4_ = 0x3f800000;
                              auVar187._0_8_ = 0x3f8000003f800000;
                              auVar187._12_4_ = 0x3f800000;
                              auVar187._16_4_ = 0x3f800000;
                              auVar187._20_4_ = 0x3f800000;
                              auVar187._24_4_ = 0x3f800000;
                              auVar187._28_4_ = 0x3f800000;
                              auVar110 = vfnmadd213ps_fma(auVar128,auVar127,auVar187);
                              auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar128,auVar128);
                              auVar176 = ZEXT1632(CONCAT412((auVar147._12_4_ + auVar147._12_4_) *
                                                            auVar110._12_4_,
                                                            CONCAT48((auVar147._8_4_ +
                                                                     auVar147._8_4_) *
                                                                     auVar110._8_4_,
                                                                     CONCAT44((auVar147._4_4_ +
                                                                              auVar147._4_4_) *
                                                                              auVar110._4_4_,
                                                                              (auVar147._0_4_ +
                                                                              auVar147._0_4_) *
                                                                              auVar110._0_4_))));
                              auVar128 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar176,2);
                              auVar129 = vcmpps_avx(auVar176,*(undefined1 (*) [32])(ray + 0x100),2);
                              auVar128 = vandps_avx(auVar128,auVar129);
                              auVar161 = ZEXT3264(auVar128);
                              auVar169._0_8_ = CONCAT44(fVar137,fVar107) ^ 0x8000000080000000;
                              auVar169._8_4_ = -fVar139;
                              auVar169._12_4_ = -fVar142;
                              auVar169._16_4_ = 0x80000000;
                              auVar169._20_4_ = 0x80000000;
                              auVar169._24_4_ = 0x80000000;
                              auVar169._28_4_ = 0x80000000;
                              auVar129 = vcmpps_avx(auVar127,auVar169,4);
                              auVar128 = vandps_avx(auVar129,auVar128);
                              auVar128 = vpslld_avx2(auVar128,0x1f);
                              auVar129 = vpsrad_avx2(auVar128,0x1f);
                              auVar128 = auVar191 & auVar129;
                              auVar191 = vandps_avx(auVar191,auVar129);
                              if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar128 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar128 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar128 >> 0x7f,0) == '\0')
                                    && (auVar128 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar128 >> 0xbf,0) == '\0')
                                  && (auVar128 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar128[0x1f])
                              goto LAB_015dac24;
                            }
                            auVar211 = ZEXT3264(CONCAT428(0x3f800003,
                                                          CONCAT424(0x3f800003,
                                                                    CONCAT420(0x3f800003,
                                                                              CONCAT416(0x3f800003,
                                                                                        CONCAT412(
                                                  0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                  ))))));
                            auVar210 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                          CONCAT424(0x3f7ffffa,
                                                                    CONCAT420(0x3f7ffffa,
                                                                              CONCAT416(0x3f7ffffa,
                                                                                        CONCAT412(
                                                  0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                  ))))));
                            auVar209 = ZEXT3264(CONCAT428(0x7f800000,
                                                          CONCAT424(0x7f800000,
                                                                    CONCAT420(0x7f800000,
                                                                              CONCAT416(0x7f800000,
                                                                                        CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                            auVar207 = ZEXT3264(auVar132);
                            auVar194 = ZEXT3264(local_2f00);
                            auVar181 = auVar166;
                            auVar152 = auVar186;
                            local_3020 = auVar166;
                            _local_2d00 = auVar26;
                            if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar191 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar191 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar191 >> 0x7f,0) != '\0') ||
                                  (auVar191 & (undefined1  [32])0x100000000) !=
                                  (undefined1  [32])0x0) || SUB321(auVar191 >> 0xbf,0) != '\0') ||
                                (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar191[0x1f] < '\0') {
                              local_2e20 = auVar176;
                              auVar128 = local_2e20;
                              local_2c60 = auVar202;
                              local_2fa0 = auVar94;
                              auVar117._0_4_ = (float)(int)(*(ushort *)(lVar25 + 8 + lVar99) - 1);
                              auVar117._4_12_ = local_2a80._4_12_;
                              auVar110 = vrcpss_avx(auVar117,auVar117);
                              auVar147 = vfnmadd213ss_fma(auVar117,auVar110,
                                                          SUB6416(ZEXT464(0x40000000),0));
                              auVar165._0_4_ = (float)(int)(*(ushort *)(lVar25 + 10 + lVar99) - 1);
                              auVar165._4_12_ = local_2a80._4_12_;
                              fVar109 = auVar110._0_4_ * auVar147._0_4_;
                              fVar108 = (float)(int)((SUB84(auVar94,0) & 1) + uVar92);
                              auVar52._4_4_ =
                                   (auVar132._4_4_ + fVar108 * (float)local_2e80._4_4_) * fVar109;
                              auVar52._0_4_ =
                                   (auVar132._0_4_ + fVar108 * (float)local_2e80._0_4_) * fVar109;
                              auVar52._8_4_ = (auVar132._8_4_ + fVar108 * fStack_2e78) * fVar109;
                              auVar52._12_4_ = (auVar132._12_4_ + fVar108 * fStack_2e74) * fVar109;
                              auVar52._16_4_ = (auVar132._16_4_ + fVar108 * fStack_2e70) * fVar109;
                              auVar52._20_4_ = (auVar132._20_4_ + fVar108 * fStack_2e6c) * fVar109;
                              auVar52._24_4_ = (auVar132._24_4_ + fVar108 * fStack_2e68) * fVar109;
                              auVar52._28_4_ = fVar109;
                              auVar110 = vrcpss_avx(auVar165,auVar165);
                              auVar132 = vblendvps_avx(auVar132,auVar52,auVar191);
                              auVar207 = ZEXT3264(auVar132);
                              auVar147 = vfnmadd213ss_fma(auVar165,auVar110,
                                                          SUB6416(ZEXT464(0x40000000),0));
                              fVar108 = (float)(int)(((uint)((ulong)auVar94 >> 1) & 0x7fffffff) +
                                                    uVar90);
                              fVar109 = auVar110._0_4_ * auVar147._0_4_;
                              auVar53._4_4_ =
                                   (auVar186._4_4_ + fVar108 * (float)local_2e80._4_4_) * fVar109;
                              auVar53._0_4_ =
                                   (auVar186._0_4_ + fVar108 * (float)local_2e80._0_4_) * fVar109;
                              auVar53._8_4_ = (auVar186._8_4_ + fVar108 * fStack_2e78) * fVar109;
                              auVar53._12_4_ = (auVar186._12_4_ + fVar108 * fStack_2e74) * fVar109;
                              auVar53._16_4_ = (auVar186._16_4_ + fVar108 * fStack_2e70) * fVar109;
                              auVar53._20_4_ = (auVar186._20_4_ + fVar108 * fStack_2e6c) * fVar109;
                              auVar53._24_4_ = (auVar186._24_4_ + fVar108 * fStack_2e68) * fVar109;
                              auVar53._28_4_ = auVar186._28_4_ + fVar108;
                              auVar152 = vblendvps_avx(auVar186,auVar53,auVar191);
                              uVar5 = *(uint *)((long)&local_2c70 + (long)auVar94 * 4);
                              unaff_R14 = (undefined1  [8])(ulong)uVar5;
                              pGVar6 = (context->scene->geometries).items[(long)unaff_R14].ptr;
                              uVar89 = pGVar6->mask;
                              auVar130._4_4_ = uVar89;
                              auVar130._0_4_ = uVar89;
                              auVar130._8_4_ = uVar89;
                              auVar130._12_4_ = uVar89;
                              auVar130._16_4_ = uVar89;
                              auVar130._20_4_ = uVar89;
                              auVar130._24_4_ = uVar89;
                              auVar130._28_4_ = uVar89;
                              auVar181 = vpand_avx2(auVar130,*(undefined1 (*) [32])(ray + 0x120));
                              auVar186 = vpcmpeqd_avx2(auVar181,_DAT_01f7b000);
                              auVar181 = auVar191 & ~auVar186;
                              if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar181 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar181 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar181 >> 0x7f,0) != '\0')
                                    || (auVar181 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar181 >> 0xbf,0) != '\0')
                                  || (auVar181 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar181[0x1f] < '\0') {
                                local_2f20._0_4_ =
                                     *(undefined4 *)((long)&local_2c80 + (long)auVar94 * 4);
                                auVar166 = vandnps_avx(auVar186,auVar191);
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  local_2ec0._0_4_ = uVar90;
                                  local_2ea0._0_4_ = uVar92;
                                  auVar186 = vrcpps_avx(_local_2e80);
                                  auVar181 = vandps_avx(_local_2e80,local_2a80);
                                  auVar179._8_4_ = 0x3f800000;
                                  auVar179._0_8_ = 0x3f8000003f800000;
                                  auVar179._12_4_ = 0x3f800000;
                                  auVar179._16_4_ = 0x3f800000;
                                  auVar179._20_4_ = 0x3f800000;
                                  auVar179._24_4_ = 0x3f800000;
                                  auVar179._28_4_ = 0x3f800000;
                                  auVar110 = vfnmadd213ps_fma(auVar186,_local_2e80,auVar179);
                                  auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar186,auVar186);
                                  auVar134._8_4_ = 0x219392ef;
                                  auVar134._0_8_ = 0x219392ef219392ef;
                                  auVar134._12_4_ = 0x219392ef;
                                  auVar134._16_4_ = 0x219392ef;
                                  auVar134._20_4_ = 0x219392ef;
                                  auVar134._24_4_ = 0x219392ef;
                                  auVar134._28_4_ = 0x219392ef;
                                  auVar186 = vcmpps_avx(auVar181,auVar134,5);
                                  auVar186 = vandps_avx(auVar186,ZEXT1632(auVar110));
                                  auVar74._4_4_ = auVar132._4_4_ * auVar186._4_4_;
                                  auVar74._0_4_ = auVar132._0_4_ * auVar186._0_4_;
                                  auVar74._8_4_ = auVar132._8_4_ * auVar186._8_4_;
                                  auVar74._12_4_ = auVar132._12_4_ * auVar186._12_4_;
                                  auVar74._16_4_ = auVar132._16_4_ * auVar186._16_4_;
                                  auVar74._20_4_ = auVar132._20_4_ * auVar186._20_4_;
                                  auVar74._24_4_ = auVar132._24_4_ * auVar186._24_4_;
                                  auVar74._28_4_ = auVar181._28_4_;
                                  local_2ba0 = vminps_avx(auVar74,auVar179);
                                  auVar75._4_4_ = auVar152._4_4_ * auVar186._4_4_;
                                  auVar75._0_4_ = auVar152._0_4_ * auVar186._0_4_;
                                  auVar75._8_4_ = auVar152._8_4_ * auVar186._8_4_;
                                  auVar75._12_4_ = auVar152._12_4_ * auVar186._12_4_;
                                  auVar75._16_4_ = auVar152._16_4_ * auVar186._16_4_;
                                  auVar75._20_4_ = auVar152._20_4_ * auVar186._20_4_;
                                  auVar75._24_4_ = auVar152._24_4_ * auVar186._24_4_;
                                  auVar75._28_4_ = auVar186._28_4_;
                                  local_2bc0 = vminps_avx(auVar75,auVar179);
                                  local_2e20._0_8_ = auVar176._0_8_;
                                  local_2e20._8_8_ = auVar176._8_8_;
                                  local_2e20._16_8_ = auVar176._16_8_;
                                  local_2e20._24_8_ = auVar176._24_8_;
                                  local_2be0 = local_2e20._0_8_;
                                  uStack_2bd8 = local_2e20._8_8_;
                                  uStack_2bd0 = local_2e20._16_8_;
                                  uStack_2bc8 = local_2e20._24_8_;
                                  local_2ff0.valid = (int *)local_29e0;
                                  local_2ff0.geometryUserPtr = &local_2a40;
                                  local_2ff0.context = local_2a20;
                                  local_2ff0.ray = (RTCRayN *)&local_2ca0;
                                  _auStack_2cf8 = SUB3224(*(undefined1 (*) [32])pRVar1,8);
                                  local_2d00 = (undefined1  [8])pGVar6;
                                  local_2fc0 = auVar132;
                                  local_2f60 = aVar222;
                                  local_2f40 = auVar152;
                                  local_2e20 = auVar128;
                                  local_2de0 = auVar191;
                                  local_2cc0 = auVar166;
                                  local_2c40.field_0.x.field_0 =
                                       (vfloat_impl<8>)(undefined1  [32])aVar222;
                                  local_2c40.field_0.y.field_0 =
                                       (vfloat_impl<8>)(undefined1  [32])local_2ee0;
                                  local_2c40._64_32_ = local_2f00;
                                  std::
                                  _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                                  ::
                                  _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                                            ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                              *)&local_2ff0,
                                             (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                              *)&local_2c40.field_0);
                                  pRVar9 = context->user;
                                  local_2ba0._4_4_ = local_2f20._0_4_;
                                  local_2ba0._0_4_ = local_2f20._0_4_;
                                  local_2ba0._8_4_ = local_2f20._0_4_;
                                  local_2ba0._12_4_ = local_2f20._0_4_;
                                  local_2ba0._16_4_ = local_2f20._0_4_;
                                  local_2ba0._20_4_ = local_2f20._0_4_;
                                  local_2ba0._24_4_ = local_2f20._0_4_;
                                  local_2ba0._28_4_ = local_2f20._0_4_;
                                  local_2c40._16_8_ = uStack_29d0;
                                  local_2c40._0_16_ = local_29e0;
                                  local_2c40._24_8_ = uStack_29c8;
                                  local_2be0 = local_2ca0._0_8_;
                                  uStack_2bd8 = local_2ca0._8_8_;
                                  uStack_2bd0 = local_2ca0._16_8_;
                                  uStack_2bc8 = local_2ca0._24_8_;
                                  local_2b80 = uVar5;
                                  uStack_2b7c = uVar5;
                                  uStack_2b78 = uVar5;
                                  uStack_2b74 = uVar5;
                                  uStack_2b70 = uVar5;
                                  uStack_2b6c = uVar5;
                                  uStack_2b68 = uVar5;
                                  uStack_2b64 = uVar5;
                                  auVar132 = vpcmpeqd_avx2(local_2ba0,local_2ba0);
                                  local_2e50[1] = auVar132;
                                  *local_2e50 = auVar132;
                                  local_2b60 = pRVar9->instID[0];
                                  uStack_2b5c = local_2b60;
                                  uStack_2b58 = local_2b60;
                                  uStack_2b54 = local_2b60;
                                  uStack_2b50 = local_2b60;
                                  uStack_2b4c = local_2b60;
                                  uStack_2b48 = local_2b60;
                                  uStack_2b44 = local_2b60;
                                  local_2b40 = pRVar9->instPrimID[0];
                                  uStack_2b3c = local_2b40;
                                  uStack_2b38 = local_2b40;
                                  uStack_2b34 = local_2b40;
                                  uStack_2b30 = local_2b40;
                                  uStack_2b2c = local_2b40;
                                  uStack_2b28 = local_2b40;
                                  uStack_2b24 = local_2b40;
                                  auVar152 = *(undefined1 (*) [32])(ray + 0x100);
                                  auVar166 = vblendvps_avx(auVar152,(undefined1  [32])local_2a40,
                                                           local_2cc0);
                                  *(undefined1 (*) [32])(ray + 0x100) = auVar166;
                                  local_2e00 = local_2cc0;
                                  local_2ff0.geometryUserPtr =
                                       (void *)*(undefined8 *)((long)local_2d00 + 0x18);
                                  local_2ff0.valid = (int *)local_2e00;
                                  local_2ff0.context = context->user;
                                  local_2ff0.ray = (RTCRayN *)ray;
                                  local_2ff0.hit = (RTCHitN *)&local_2c40;
                                  local_2ff0.N = 8;
                                  if (*(code **)((long)local_2d00 + 0x48) != (code *)0x0) {
                                    _local_2f20 = auVar152;
                                    (**(code **)((long)local_2d00 + 0x48))(&local_2ff0);
                                    auVar207._8_56_ = extraout_var;
                                    auVar207._0_8_ = extraout_XMM1_Qa;
                                    auVar132 = vpcmpeqd_avx2(auVar207._0_32_,auVar207._0_32_);
                                    auVar152 = _local_2f20;
                                  }
                                  auVar166 = vpcmpeqd_avx2(local_2e00,_DAT_01f7b000);
                                  auVar181 = auVar132 & ~auVar166;
                                  uVar90 = local_2ec0._0_4_;
                                  aVar222 = local_2f60;
                                  uVar92 = local_2ea0._0_4_;
                                  if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar181 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar181 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar181 >> 0x7f,0) == '\0') &&
                                        (auVar181 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar181 >> 0xbf,0) == '\0'
                                       ) && (auVar181 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) && -1 < auVar181[0x1f]) {
                                    auVar166 = auVar166 ^ auVar132;
                                    auVar209 = ZEXT3264(CONCAT428(0x7f800000,
                                                                  CONCAT424(0x7f800000,
                                                                            CONCAT420(0x7f800000,
                                                                                      CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                                    auVar210 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                                  CONCAT424(0x3f7ffffa,
                                                                            CONCAT420(0x3f7ffffa,
                                                                                      CONCAT416(
                                                  0x3f7ffffa,
                                                  CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                  )))));
                                    auVar211 = ZEXT3264(CONCAT428(0x3f800003,
                                                                  CONCAT424(0x3f800003,
                                                                            CONCAT420(0x3f800003,
                                                                                      CONCAT416(
                                                  0x3f800003,
                                                  CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                  )))));
                                    auVar207 = ZEXT3264(local_2fc0);
                                    auVar194 = ZEXT3264(local_2f00);
                                    auVar94 = local_2fa0;
                                  }
                                  else {
                                    p_Var8 = context->args->filter;
                                    if (p_Var8 == (RTCFilterFunctionN)0x0) {
                                      auVar209 = ZEXT3264(CONCAT428(0x7f800000,
                                                                    CONCAT424(0x7f800000,
                                                                              CONCAT420(0x7f800000,
                                                                                        CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                                      auVar210 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                                    CONCAT424(0x3f7ffffa,
                                                                              CONCAT420(0x3f7ffffa,
                                                                                        CONCAT416(
                                                  0x3f7ffffa,
                                                  CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                  )))));
                                      auVar211 = ZEXT3264(CONCAT428(0x3f800003,
                                                                    CONCAT424(0x3f800003,
                                                                              CONCAT420(0x3f800003,
                                                                                        CONCAT416(
                                                  0x3f800003,
                                                  CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                  )))));
                                      auVar207 = ZEXT3264(local_2fc0);
                                      auVar194 = ZEXT3264(local_2f00);
                                    }
                                    else {
                                      auVar209 = ZEXT3264(CONCAT428(0x7f800000,
                                                                    CONCAT424(0x7f800000,
                                                                              CONCAT420(0x7f800000,
                                                                                        CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                                      auVar210 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                                    CONCAT424(0x3f7ffffa,
                                                                              CONCAT420(0x3f7ffffa,
                                                                                        CONCAT416(
                                                  0x3f7ffffa,
                                                  CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                  )))));
                                      auVar211 = ZEXT3264(CONCAT428(0x3f800003,
                                                                    CONCAT424(0x3f800003,
                                                                              CONCAT420(0x3f800003,
                                                                                        CONCAT416(
                                                  0x3f800003,
                                                  CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                  )))));
                                      auVar207 = ZEXT3264(local_2fc0);
                                      auVar194 = ZEXT3264(local_2f00);
                                      if (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                         ((*(byte *)((long)local_2d00 + 0x3e) & 0x40) != 0)) {
                                        _local_2f20 = auVar152;
                                        (*p_Var8)(&local_2ff0);
                                        auVar194 = ZEXT3264(local_2f00);
                                        auVar207 = ZEXT3264(local_2fc0);
                                        auVar211 = ZEXT3264(CONCAT428(0x3f800003,
                                                                      CONCAT424(0x3f800003,
                                                                                CONCAT420(0x3f800003
                                                                                          ,CONCAT416
                                                  (0x3f800003,
                                                   CONCAT412(0x3f800003,
                                                             CONCAT48(0x3f800003,0x3f8000033f800003)
                                                            ))))));
                                        auVar210 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                                      CONCAT424(0x3f7ffffa,
                                                                                CONCAT420(0x3f7ffffa
                                                                                          ,CONCAT416
                                                  (0x3f7ffffa,
                                                   CONCAT412(0x3f7ffffa,
                                                             CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                            ))))));
                                        auVar209 = ZEXT3264(CONCAT428(0x7f800000,
                                                                      CONCAT424(0x7f800000,
                                                                                CONCAT420(0x7f800000
                                                                                          ,CONCAT416
                                                  (0x7f800000,
                                                   CONCAT412(0x7f800000,
                                                             CONCAT48(0x7f800000,0x7f8000007f800000)
                                                            ))))));
                                        uVar90 = local_2ec0._0_4_;
                                        auVar152 = _local_2f20;
                                        aVar222 = local_2f60;
                                        uVar92 = local_2ea0._0_4_;
                                      }
                                    }
                                    auVar132 = vpcmpeqd_avx2(local_2e00,_DAT_01f7b000);
                                    auVar166 = auVar132 ^ _DAT_01f7b020;
                                    auVar158._8_4_ = 0xff800000;
                                    auVar158._0_8_ = 0xff800000ff800000;
                                    auVar158._12_4_ = 0xff800000;
                                    auVar158._16_4_ = 0xff800000;
                                    auVar158._20_4_ = 0xff800000;
                                    auVar158._24_4_ = 0xff800000;
                                    auVar158._28_4_ = 0xff800000;
                                    auVar132 = vblendvps_avx(auVar158,*(undefined1 (*) [32])
                                                                       (local_2ff0.ray + 0x100),
                                                             auVar132);
                                    *(undefined1 (*) [32])(local_2ff0.ray + 0x100) = auVar132;
                                    auVar94 = local_2fa0;
                                  }
                                  auVar152 = vblendvps_avx(auVar152,*(undefined1 (*) [32])local_2f68
                                                           ,auVar166);
                                  *(undefined1 (*) [32])local_2f68 = auVar152;
                                  auVar191 = local_2de0;
                                  auVar152 = local_2f40;
                                }
                                auVar166 = vandnps_avx(auVar166,local_3020);
                              }
                              auVar161 = ZEXT3264(auVar166);
                              auVar181 = vandnps_avx(auVar191,local_3020);
                              auVar176 = local_2e20;
                              auVar202 = local_2c60;
                            }
                            auVar205 = ZEXT3264(auVar166);
                            auVar203 = ZEXT3264(auVar202);
                            local_2f60 = auVar194._0_32_;
                            if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar181 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar181 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar181 >> 0x7f,0) == '\0') &&
                                  (auVar181 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar181 >> 0xbf,0) == '\0') &&
                                (auVar181 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar181[0x1f]) {
                              local_2dc0 = _local_2e80;
                              local_2d60 = auVar176;
                              local_2d20 = aVar222;
                              local_2d40 = local_2ee0;
                              auVar223 = ZEXT3264(local_2e40);
                            }
                            else {
                              local_2e20 = auVar176;
                              local_2f00 = (undefined1  [32])local_2f60;
                              local_2f40 = auVar152;
                              auVar128 = auVar207._0_32_;
                              local_2fc0 = auVar128;
                              auVar132 = *(undefined1 (*) [32])ray;
                              auVar181 = *(undefined1 (*) [32])(ray + 0x20);
                              local_2c60 = auVar202;
                              auVar79 = local_2c60;
                              auVar186 = *(undefined1 (*) [32])(ray + 0x40);
                              auVar86._4_4_ = uStack_265c;
                              auVar86._0_4_ = local_2660;
                              auVar86._8_4_ = uStack_2658;
                              auVar86._12_4_ = uStack_2654;
                              auVar86._16_4_ = uStack_2650;
                              auVar86._20_4_ = uStack_264c;
                              auVar86._24_4_ = uStack_2648;
                              auVar86._28_4_ = uStack_2644;
                              local_2ea0 = vsubps_avx(auVar86,auVar132);
                              local_2ec0 = vsubps_avx(local_2680,auVar181);
                              auVar85._4_4_ = uStack_269c;
                              auVar85._0_4_ = local_26a0;
                              auVar85._8_4_ = uStack_2698;
                              auVar85._12_4_ = uStack_2694;
                              auVar85._16_4_ = uStack_2690;
                              auVar85._20_4_ = uStack_268c;
                              auVar85._24_4_ = uStack_2688;
                              auVar85._28_4_ = uStack_2684;
                              local_2de0 = vsubps_avx(auVar85,auVar186);
                              auVar191 = vsubps_avx(local_2aa0,auVar132);
                              auVar129 = vsubps_avx(local_2ac0,auVar181);
                              auVar127 = vsubps_avx(local_2ae0,auVar186);
                              auVar21 = vsubps_avx(local_2b00,auVar132);
                              auVar181 = vsubps_avx(local_2b20,auVar181);
                              auVar186 = vsubps_avx(local_2640,auVar186);
                              _local_2d00 = vsubps_avx(auVar21,local_2ea0);
                              local_2a60 = vsubps_avx(auVar181,local_2ec0);
                              local_2cc0 = vsubps_avx(auVar186,local_2de0);
                              auVar157._0_4_ = auVar21._0_4_ + local_2ea0._0_4_;
                              auVar157._4_4_ = auVar21._4_4_ + local_2ea0._4_4_;
                              auVar157._8_4_ = auVar21._8_4_ + local_2ea0._8_4_;
                              auVar157._12_4_ = auVar21._12_4_ + local_2ea0._12_4_;
                              auVar157._16_4_ = auVar21._16_4_ + local_2ea0._16_4_;
                              auVar157._20_4_ = auVar21._20_4_ + local_2ea0._20_4_;
                              auVar157._24_4_ = auVar21._24_4_ + local_2ea0._24_4_;
                              auVar157._28_4_ = auVar21._28_4_ + local_2ea0._28_4_;
                              auVar204._0_4_ = auVar181._0_4_ + local_2ec0._0_4_;
                              auVar204._4_4_ = auVar181._4_4_ + local_2ec0._4_4_;
                              auVar204._8_4_ = auVar181._8_4_ + local_2ec0._8_4_;
                              auVar204._12_4_ = auVar181._12_4_ + local_2ec0._12_4_;
                              auVar204._16_4_ = auVar181._16_4_ + local_2ec0._16_4_;
                              auVar204._20_4_ = auVar181._20_4_ + local_2ec0._20_4_;
                              auVar204._24_4_ = auVar181._24_4_ + local_2ec0._24_4_;
                              fVar109 = local_2ec0._28_4_;
                              auVar204._28_4_ = auVar181._28_4_ + fVar109;
                              fVar212 = local_2de0._0_4_;
                              auVar208._0_4_ = fVar212 + auVar186._0_4_;
                              fVar213 = local_2de0._4_4_;
                              auVar208._4_4_ = fVar213 + auVar186._4_4_;
                              fVar215 = local_2de0._8_4_;
                              auVar208._8_4_ = fVar215 + auVar186._8_4_;
                              fVar216 = local_2de0._12_4_;
                              auVar208._12_4_ = fVar216 + auVar186._12_4_;
                              fVar217 = local_2de0._16_4_;
                              auVar208._16_4_ = fVar217 + auVar186._16_4_;
                              fVar218 = local_2de0._20_4_;
                              auVar208._20_4_ = fVar218 + auVar186._20_4_;
                              fVar219 = local_2de0._24_4_;
                              auVar208._24_4_ = fVar219 + auVar186._24_4_;
                              auVar208._28_4_ = local_2de0._28_4_ + auVar186._28_4_;
                              auVar209._0_4_ = auVar204._0_4_ * local_2cc0._0_4_;
                              auVar209._4_4_ = auVar204._4_4_ * local_2cc0._4_4_;
                              auVar209._8_4_ = auVar204._8_4_ * local_2cc0._8_4_;
                              auVar209._12_4_ = auVar204._12_4_ * local_2cc0._12_4_;
                              auVar209._16_4_ = auVar204._16_4_ * local_2cc0._16_4_;
                              auVar209._20_4_ = auVar204._20_4_ * local_2cc0._20_4_;
                              auVar209._28_36_ = auVar210._28_36_;
                              auVar209._24_4_ = auVar204._24_4_ * local_2cc0._24_4_;
                              auVar147 = vfmsub231ps_fma(auVar209._0_32_,local_2a60,auVar208);
                              auVar54._4_4_ = auVar208._4_4_ * local_2d00._4_4_;
                              auVar54._0_4_ = auVar208._0_4_ * local_2d00._0_4_;
                              auVar54._8_4_ = auVar208._8_4_ * local_2d00._8_4_;
                              auVar54._12_4_ = auVar208._12_4_ * local_2d00._12_4_;
                              auVar54._16_4_ = auVar208._16_4_ * local_2d00._16_4_;
                              auVar54._20_4_ = auVar208._20_4_ * local_2d00._20_4_;
                              auVar54._24_4_ = auVar208._24_4_ * local_2d00._24_4_;
                              auVar54._28_4_ = auVar208._28_4_;
                              auVar110 = vfmsub231ps_fma(auVar54,local_2cc0,auVar157);
                              auVar55._4_4_ = auVar157._4_4_ * local_2a60._4_4_;
                              auVar55._0_4_ = auVar157._0_4_ * local_2a60._0_4_;
                              auVar55._8_4_ = auVar157._8_4_ * local_2a60._8_4_;
                              auVar55._12_4_ = auVar157._12_4_ * local_2a60._12_4_;
                              auVar55._16_4_ = auVar157._16_4_ * local_2a60._16_4_;
                              auVar55._20_4_ = auVar157._20_4_ * local_2a60._20_4_;
                              auVar55._24_4_ = auVar157._24_4_ * local_2a60._24_4_;
                              auVar55._28_4_ = auVar157._28_4_;
                              auVar111 = vfmsub231ps_fma(auVar55,_local_2d00,auVar204);
                              pRVar1 = ray + 0xc0;
                              fVar136 = *(float *)pRVar1;
                              fVar138 = *(float *)(ray + 0xc4);
                              fVar141 = *(float *)(ray + 200);
                              fVar144 = *(float *)(ray + 0xcc);
                              fVar145 = *(float *)(ray + 0xd0);
                              fVar146 = *(float *)(ray + 0xd4);
                              fVar78 = *(float *)(ray + 0xd8);
                              auVar87 = *(undefined1 (*) [28])pRVar1;
                              auVar56._4_4_ = auVar111._4_4_ * fVar138;
                              auVar56._0_4_ = auVar111._0_4_ * fVar136;
                              auVar56._8_4_ = auVar111._8_4_ * fVar141;
                              auVar56._12_4_ = auVar111._12_4_ * fVar144;
                              auVar56._16_4_ = fVar145 * 0.0;
                              auVar56._20_4_ = fVar146 * 0.0;
                              auVar56._24_4_ = fVar78 * 0.0;
                              auVar56._28_4_ = local_2cc0._28_4_;
                              _local_2f20 = *(undefined1 (*) [32])(ray + 0xa0);
                              auVar110 = vfmadd231ps_fma(auVar56,_local_2f20,ZEXT1632(auVar110));
                              auVar132 = *(undefined1 (*) [32])(ray + 0x80);
                              auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar132,
                                                         ZEXT1632(auVar147));
                              auVar203 = ZEXT1664(auVar110);
                              local_2aa0 = vsubps_avx(local_2ec0,auVar129);
                              local_2ae0 = vsubps_avx(local_2de0,auVar127);
                              auVar170._0_4_ = local_2ec0._0_4_ + auVar129._0_4_;
                              auVar170._4_4_ = local_2ec0._4_4_ + auVar129._4_4_;
                              auVar170._8_4_ = local_2ec0._8_4_ + auVar129._8_4_;
                              auVar170._12_4_ = local_2ec0._12_4_ + auVar129._12_4_;
                              auVar170._16_4_ = local_2ec0._16_4_ + auVar129._16_4_;
                              auVar170._20_4_ = local_2ec0._20_4_ + auVar129._20_4_;
                              auVar170._24_4_ = local_2ec0._24_4_ + auVar129._24_4_;
                              fVar108 = auVar129._28_4_;
                              auVar170._28_4_ = fVar109 + fVar108;
                              auVar221._0_4_ = fVar212 + auVar127._0_4_;
                              auVar221._4_4_ = fVar213 + auVar127._4_4_;
                              auVar221._8_4_ = fVar215 + auVar127._8_4_;
                              auVar221._12_4_ = fVar216 + auVar127._12_4_;
                              auVar221._16_4_ = fVar217 + auVar127._16_4_;
                              auVar221._20_4_ = fVar218 + auVar127._20_4_;
                              auVar221._24_4_ = fVar219 + auVar127._24_4_;
                              auVar221._28_4_ = local_2de0._28_4_ + auVar127._28_4_;
                              fVar140 = local_2ae0._0_4_;
                              fVar195 = local_2ae0._4_4_;
                              auVar57._4_4_ = auVar170._4_4_ * fVar195;
                              auVar57._0_4_ = auVar170._0_4_ * fVar140;
                              fVar107 = local_2ae0._8_4_;
                              auVar57._8_4_ = auVar170._8_4_ * fVar107;
                              fVar142 = local_2ae0._12_4_;
                              auVar57._12_4_ = auVar170._12_4_ * fVar142;
                              fVar13 = local_2ae0._16_4_;
                              auVar57._16_4_ = auVar170._16_4_ * fVar13;
                              fVar16 = local_2ae0._20_4_;
                              auVar57._20_4_ = auVar170._20_4_ * fVar16;
                              fVar19 = local_2ae0._24_4_;
                              auVar57._24_4_ = auVar170._24_4_ * fVar19;
                              auVar57._28_4_ = fVar109;
                              auVar111 = vfmsub231ps_fma(auVar57,local_2aa0,auVar221);
                              local_2ac0 = vsubps_avx(local_2ea0,auVar191);
                              fVar109 = local_2ac0._0_4_;
                              fVar196 = local_2ac0._4_4_;
                              auVar58._4_4_ = auVar221._4_4_ * fVar196;
                              auVar58._0_4_ = auVar221._0_4_ * fVar109;
                              fVar137 = local_2ac0._8_4_;
                              auVar58._8_4_ = auVar221._8_4_ * fVar137;
                              fVar11 = local_2ac0._12_4_;
                              auVar58._12_4_ = auVar221._12_4_ * fVar11;
                              fVar14 = local_2ac0._16_4_;
                              auVar58._16_4_ = auVar221._16_4_ * fVar14;
                              fVar17 = local_2ac0._20_4_;
                              auVar58._20_4_ = auVar221._20_4_ * fVar17;
                              fVar20 = local_2ac0._24_4_;
                              auVar58._24_4_ = auVar221._24_4_ * fVar20;
                              auVar58._28_4_ = auVar221._28_4_;
                              auVar198._0_4_ = local_2ea0._0_4_ + auVar191._0_4_;
                              auVar198._4_4_ = local_2ea0._4_4_ + auVar191._4_4_;
                              auVar198._8_4_ = local_2ea0._8_4_ + auVar191._8_4_;
                              auVar198._12_4_ = local_2ea0._12_4_ + auVar191._12_4_;
                              auVar198._16_4_ = local_2ea0._16_4_ + auVar191._16_4_;
                              auVar198._20_4_ = local_2ea0._20_4_ + auVar191._20_4_;
                              auVar198._24_4_ = local_2ea0._24_4_ + auVar191._24_4_;
                              auVar198._28_4_ = local_2ea0._28_4_ + auVar191._28_4_;
                              auVar147 = vfmsub231ps_fma(auVar58,local_2ae0,auVar198);
                              fVar143 = local_2aa0._0_4_;
                              fVar10 = local_2aa0._4_4_;
                              auVar59._4_4_ = auVar198._4_4_ * fVar10;
                              auVar59._0_4_ = auVar198._0_4_ * fVar143;
                              fVar139 = local_2aa0._8_4_;
                              auVar59._8_4_ = auVar198._8_4_ * fVar139;
                              fVar12 = local_2aa0._12_4_;
                              auVar59._12_4_ = auVar198._12_4_ * fVar12;
                              fVar15 = local_2aa0._16_4_;
                              auVar59._16_4_ = auVar198._16_4_ * fVar15;
                              fVar18 = local_2aa0._20_4_;
                              auVar59._20_4_ = auVar198._20_4_ * fVar18;
                              fVar106 = local_2aa0._24_4_;
                              auVar59._24_4_ = auVar198._24_4_ * fVar106;
                              auVar59._28_4_ = auVar198._28_4_;
                              auVar112 = vfmsub231ps_fma(auVar59,local_2ac0,auVar170);
                              auVar60._4_4_ = auVar112._4_4_ * fVar138;
                              auVar60._0_4_ = auVar112._0_4_ * fVar136;
                              auVar60._8_4_ = auVar112._8_4_ * fVar141;
                              auVar60._12_4_ = auVar112._12_4_ * fVar144;
                              auVar60._16_4_ = fVar145 * 0.0;
                              auVar60._20_4_ = fVar146 * 0.0;
                              auVar60._24_4_ = fVar78 * 0.0;
                              auVar60._28_4_ = local_2aa0._28_4_;
                              local_2c60._0_4_ = auVar202._0_4_;
                              local_2c60._4_4_ = auVar202._4_4_;
                              local_2c60._8_4_ = auVar202._8_4_;
                              local_2c60._12_4_ = auVar202._12_4_;
                              local_2c60._16_4_ = auVar202._16_4_;
                              local_2c60._20_4_ = auVar202._20_4_;
                              local_2c60._24_4_ = auVar202._24_4_;
                              local_2c60._28_4_ = auVar202._28_4_;
                              auVar147 = vfmadd231ps_fma(auVar60,_local_2f20,ZEXT1632(auVar147));
                              auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar132,
                                                         ZEXT1632(auVar111));
                              auVar161 = ZEXT1664(auVar147);
                              auVar22 = vsubps_avx(auVar191,auVar21);
                              auVar171._0_4_ = auVar191._0_4_ + auVar21._0_4_;
                              auVar171._4_4_ = auVar191._4_4_ + auVar21._4_4_;
                              auVar171._8_4_ = auVar191._8_4_ + auVar21._8_4_;
                              auVar171._12_4_ = auVar191._12_4_ + auVar21._12_4_;
                              auVar171._16_4_ = auVar191._16_4_ + auVar21._16_4_;
                              auVar171._20_4_ = auVar191._20_4_ + auVar21._20_4_;
                              auVar171._24_4_ = auVar191._24_4_ + auVar21._24_4_;
                              auVar171._28_4_ = auVar191._28_4_ + auVar21._28_4_;
                              auVar21 = vsubps_avx(auVar129,auVar181);
                              auVar177._0_4_ = auVar129._0_4_ + auVar181._0_4_;
                              auVar177._4_4_ = auVar129._4_4_ + auVar181._4_4_;
                              auVar177._8_4_ = auVar129._8_4_ + auVar181._8_4_;
                              auVar177._12_4_ = auVar129._12_4_ + auVar181._12_4_;
                              auVar177._16_4_ = auVar129._16_4_ + auVar181._16_4_;
                              auVar177._20_4_ = auVar129._20_4_ + auVar181._20_4_;
                              auVar177._24_4_ = auVar129._24_4_ + auVar181._24_4_;
                              auVar177._28_4_ = fVar108 + auVar181._28_4_;
                              auVar23 = vsubps_avx(auVar127,auVar186);
                              auVar131._0_4_ = auVar127._0_4_ + auVar186._0_4_;
                              auVar131._4_4_ = auVar127._4_4_ + auVar186._4_4_;
                              auVar131._8_4_ = auVar127._8_4_ + auVar186._8_4_;
                              auVar131._12_4_ = auVar127._12_4_ + auVar186._12_4_;
                              auVar131._16_4_ = auVar127._16_4_ + auVar186._16_4_;
                              auVar131._20_4_ = auVar127._20_4_ + auVar186._20_4_;
                              auVar131._24_4_ = auVar127._24_4_ + auVar186._24_4_;
                              auVar131._28_4_ = auVar127._28_4_ + auVar186._28_4_;
                              auVar61._4_4_ = auVar23._4_4_ * auVar177._4_4_;
                              auVar61._0_4_ = auVar23._0_4_ * auVar177._0_4_;
                              auVar61._8_4_ = auVar23._8_4_ * auVar177._8_4_;
                              auVar61._12_4_ = auVar23._12_4_ * auVar177._12_4_;
                              auVar61._16_4_ = auVar23._16_4_ * auVar177._16_4_;
                              auVar61._20_4_ = auVar23._20_4_ * auVar177._20_4_;
                              auVar61._24_4_ = auVar23._24_4_ * auVar177._24_4_;
                              auVar61._28_4_ = fVar108;
                              auVar112 = vfmsub231ps_fma(auVar61,auVar21,auVar131);
                              auVar62._4_4_ = auVar22._4_4_ * auVar131._4_4_;
                              auVar62._0_4_ = auVar22._0_4_ * auVar131._0_4_;
                              auVar62._8_4_ = auVar22._8_4_ * auVar131._8_4_;
                              auVar62._12_4_ = auVar22._12_4_ * auVar131._12_4_;
                              auVar62._16_4_ = auVar22._16_4_ * auVar131._16_4_;
                              auVar62._20_4_ = auVar22._20_4_ * auVar131._20_4_;
                              auVar62._24_4_ = auVar22._24_4_ * auVar131._24_4_;
                              auVar62._28_4_ = auVar131._28_4_;
                              auVar111 = vfmsub231ps_fma(auVar62,auVar23,auVar171);
                              auVar63._4_4_ = auVar21._4_4_ * auVar171._4_4_;
                              auVar63._0_4_ = auVar21._0_4_ * auVar171._0_4_;
                              auVar63._8_4_ = auVar21._8_4_ * auVar171._8_4_;
                              auVar63._12_4_ = auVar21._12_4_ * auVar171._12_4_;
                              auVar63._16_4_ = auVar21._16_4_ * auVar171._16_4_;
                              auVar63._20_4_ = auVar21._20_4_ * auVar171._20_4_;
                              auVar63._24_4_ = auVar21._24_4_ * auVar171._24_4_;
                              auVar63._28_4_ = auVar171._28_4_;
                              auVar113 = vfmsub231ps_fma(auVar63,auVar22,auVar177);
                              _local_2fa0 = *(undefined1 (*) [32])pRVar1;
                              auVar26 = _local_2fa0;
                              auVar172._0_4_ = auVar113._0_4_ * fVar136;
                              auVar172._4_4_ = auVar113._4_4_ * fVar138;
                              auVar172._8_4_ = auVar113._8_4_ * fVar141;
                              auVar172._12_4_ = auVar113._12_4_ * fVar144;
                              auVar172._16_4_ = fVar145 * 0.0;
                              auVar172._20_4_ = fVar146 * 0.0;
                              auVar172._24_4_ = fVar78 * 0.0;
                              auVar172._28_4_ = 0;
                              auVar111 = vfmadd231ps_fma(auVar172,_local_2f20,ZEXT1632(auVar111));
                              auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar132,
                                                         ZEXT1632(auVar112));
                              local_2dc0 = ZEXT1632(CONCAT412(auVar111._12_4_ +
                                                              auVar110._12_4_ + auVar147._12_4_,
                                                              CONCAT48(auVar111._8_4_ +
                                                                       auVar110._8_4_ +
                                                                       auVar147._8_4_,
                                                                       CONCAT44(auVar111._4_4_ +
                                                                                auVar110._4_4_ +
                                                                                auVar147._4_4_,
                                                                                auVar111._0_4_ +
                                                                                auVar110._0_4_ +
                                                                                auVar147._0_4_))));
                              auVar181 = vandps_avx(local_2dc0,local_2a80);
                              fVar108 = auVar181._0_4_ * 1.1920929e-07;
                              fVar136 = auVar181._4_4_ * 1.1920929e-07;
                              auVar64._4_4_ = fVar136;
                              auVar64._0_4_ = fVar108;
                              fVar138 = auVar181._8_4_ * 1.1920929e-07;
                              auVar64._8_4_ = fVar138;
                              fVar141 = auVar181._12_4_ * 1.1920929e-07;
                              auVar64._12_4_ = fVar141;
                              fVar144 = auVar181._16_4_ * 1.1920929e-07;
                              auVar64._16_4_ = fVar144;
                              fVar145 = auVar181._20_4_ * 1.1920929e-07;
                              auVar64._20_4_ = fVar145;
                              fVar146 = auVar181._24_4_ * 1.1920929e-07;
                              auVar64._24_4_ = fVar146;
                              auVar64._28_4_ = auVar181._28_4_;
                              local_2b00 = ZEXT1632(auVar110);
                              auVar186 = vminps_avx(local_2b00,ZEXT1632(auVar147));
                              auVar186 = vminps_avx(auVar186,ZEXT1632(auVar111));
                              auVar188._0_4_ = local_2c60._0_4_ ^ (uint)fVar108;
                              auVar188._4_4_ = local_2c60._4_4_ ^ (uint)fVar136;
                              auVar188._8_4_ = local_2c60._8_4_ ^ (uint)fVar138;
                              auVar188._12_4_ = local_2c60._12_4_ ^ (uint)fVar141;
                              auVar188._16_4_ = local_2c60._16_4_ ^ (uint)fVar144;
                              auVar188._20_4_ = local_2c60._20_4_ ^ (uint)fVar145;
                              auVar188._24_4_ = local_2c60._24_4_ ^ (uint)fVar146;
                              auVar188._28_4_ = local_2c60._28_4_ ^ auVar181._28_4_;
                              auVar186 = vcmpps_avx(auVar186,auVar188,5);
                              auVar191 = vmaxps_avx(local_2b00,ZEXT1632(auVar147));
                              auVar181 = vmaxps_avx(auVar191,ZEXT1632(auVar111));
                              auVar181 = vcmpps_avx(auVar181,auVar64,2);
                              auVar129 = vorps_avx(auVar186,auVar181);
                              auVar24 = auVar166 & auVar129;
                              auVar181 = vandps_avx(auVar129,auVar166);
                              auVar207 = ZEXT3264(auVar181);
                              auVar127 = local_2ac0;
                              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar24 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar24 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar24 >> 0x7f,0) == '\0')
                                    && (auVar24 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar24 >> 0xbf,0) == '\0')
                                  && (auVar24 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar24[0x1f]) {
LAB_015dac92:
                                auVar214 = auVar127._4_12_;
                                auVar161 = ZEXT3264(auVar152);
                                local_2dc0 = _local_2e80;
                                local_2d60 = auVar176;
                                local_2d20 = aVar222;
                                local_2d40 = local_2ee0;
                              }
                              else {
                                auVar65._4_4_ = fVar10 * local_2cc0._4_4_;
                                auVar65._0_4_ = fVar143 * local_2cc0._0_4_;
                                auVar65._8_4_ = fVar139 * local_2cc0._8_4_;
                                auVar65._12_4_ = fVar12 * local_2cc0._12_4_;
                                auVar65._16_4_ = fVar15 * local_2cc0._16_4_;
                                auVar65._20_4_ = fVar18 * local_2cc0._20_4_;
                                auVar65._24_4_ = fVar106 * local_2cc0._24_4_;
                                auVar65._28_4_ = auVar129._28_4_;
                                local_2b20 = auVar181;
                                auVar66._4_4_ = fVar196 * local_2a60._4_4_;
                                auVar66._0_4_ = fVar109 * local_2a60._0_4_;
                                auVar66._8_4_ = fVar137 * local_2a60._8_4_;
                                auVar66._12_4_ = fVar11 * local_2a60._12_4_;
                                auVar66._16_4_ = fVar14 * local_2a60._16_4_;
                                auVar66._20_4_ = fVar17 * local_2a60._20_4_;
                                auVar66._24_4_ = fVar20 * local_2a60._24_4_;
                                auVar66._28_4_ = auVar181._28_4_;
                                auVar214 = local_2ae0._4_12_;
                                auVar110 = vfmsub213ps_fma(local_2a60,local_2ae0,auVar65);
                                auVar67._4_4_ = auVar21._4_4_ * fVar195;
                                auVar67._0_4_ = auVar21._0_4_ * fVar140;
                                auVar67._8_4_ = auVar21._8_4_ * fVar107;
                                auVar67._12_4_ = auVar21._12_4_ * fVar142;
                                auVar67._16_4_ = auVar21._16_4_ * fVar13;
                                auVar67._20_4_ = auVar21._20_4_ * fVar16;
                                auVar67._24_4_ = auVar21._24_4_ * fVar19;
                                auVar67._28_4_ = auVar186._28_4_;
                                auVar68._4_4_ = fVar196 * auVar23._4_4_;
                                auVar68._0_4_ = fVar109 * auVar23._0_4_;
                                auVar68._8_4_ = fVar137 * auVar23._8_4_;
                                auVar68._12_4_ = fVar11 * auVar23._12_4_;
                                auVar68._16_4_ = fVar14 * auVar23._16_4_;
                                auVar68._20_4_ = fVar17 * auVar23._20_4_;
                                auVar68._24_4_ = fVar20 * auVar23._24_4_;
                                auVar68._28_4_ = auVar191._28_4_;
                                auVar147 = vfmsub213ps_fma(auVar23,local_2aa0,auVar67);
                                auVar186 = vandps_avx(auVar65,local_2a80);
                                auVar191 = vandps_avx(auVar67,local_2a80);
                                auVar186 = vcmpps_avx(auVar186,auVar191,1);
                                local_2d20 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                             vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar110),
                                                           auVar186);
                                auVar69._4_4_ = auVar22._4_4_ * fVar10;
                                auVar69._0_4_ = auVar22._0_4_ * fVar143;
                                auVar69._8_4_ = auVar22._8_4_ * fVar139;
                                auVar69._12_4_ = auVar22._12_4_ * fVar12;
                                auVar69._16_4_ = auVar22._16_4_ * fVar15;
                                auVar69._20_4_ = auVar22._20_4_ * fVar18;
                                auVar69._24_4_ = auVar22._24_4_ * fVar106;
                                auVar69._28_4_ = auVar186._28_4_;
                                auVar110 = vfmsub213ps_fma(auVar22,local_2ae0,auVar68);
                                auVar70._4_4_ = fVar195 * local_2d00._4_4_;
                                auVar70._0_4_ = fVar140 * local_2d00._0_4_;
                                auVar70._8_4_ = fVar107 * local_2d00._8_4_;
                                auVar70._12_4_ = fVar142 * local_2d00._12_4_;
                                auVar70._16_4_ = fVar13 * local_2d00._16_4_;
                                auVar70._20_4_ = fVar16 * local_2d00._20_4_;
                                auVar70._24_4_ = fVar19 * local_2d00._24_4_;
                                auVar70._28_4_ = auVar191._28_4_;
                                auVar147 = vfmsub213ps_fma(local_2cc0,local_2ac0,auVar70);
                                auVar186 = vandps_avx(auVar70,local_2a80);
                                auVar191 = vandps_avx(auVar68,local_2a80);
                                auVar186 = vcmpps_avx(auVar186,auVar191,1);
                                local_2d40 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                             vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar147),
                                                           auVar186);
                                auVar110 = vfmsub213ps_fma(_local_2d00,local_2aa0,auVar66);
                                auVar147 = vfmsub213ps_fma(auVar21,local_2ac0,auVar69);
                                auVar186 = vandps_avx(auVar66,local_2a80);
                                auVar191 = vandps_avx(auVar69,local_2a80);
                                auVar191 = vcmpps_avx(auVar186,auVar191,1);
                                auVar186 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar110),
                                                         auVar191);
                                auVar203 = ZEXT3264(auVar186);
                                local_2fa0._0_4_ = auVar87._0_4_;
                                local_2fa0._4_4_ = auVar87._4_4_;
                                auStack_2f98._0_4_ = auVar87._8_4_;
                                auStack_2f98._4_4_ = auVar87._12_4_;
                                fStack_2f90 = auVar87._16_4_;
                                fStack_2f8c = auVar87._20_4_;
                                fStack_2f88 = auVar87._24_4_;
                                auVar71._4_4_ = auVar186._4_4_ * (float)local_2fa0._4_4_;
                                auVar71._0_4_ = auVar186._0_4_ * (float)local_2fa0._0_4_;
                                auVar71._8_4_ = auVar186._8_4_ * (float)auStack_2f98._0_4_;
                                auVar71._12_4_ = auVar186._12_4_ * (float)auStack_2f98._4_4_;
                                auVar71._16_4_ = auVar186._16_4_ * fStack_2f90;
                                auVar71._20_4_ = auVar186._20_4_ * fStack_2f8c;
                                auVar71._24_4_ = auVar186._24_4_ * fStack_2f88;
                                auVar71._28_4_ = auVar191._28_4_;
                                auVar110 = vfmadd213ps_fma(_local_2f20,(undefined1  [32])local_2d40,
                                                           auVar71);
                                auVar110 = vfmadd213ps_fma(auVar132,(undefined1  [32])local_2d20,
                                                           ZEXT1632(auVar110));
                                fVar109 = auVar110._0_4_ + auVar110._0_4_;
                                fVar108 = auVar110._4_4_ + auVar110._4_4_;
                                fVar140 = auVar110._8_4_ + auVar110._8_4_;
                                fVar143 = auVar110._12_4_ + auVar110._12_4_;
                                auVar129 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar140,CONCAT44(
                                                  fVar108,fVar109))));
                                auVar173._0_4_ = auVar186._0_4_ * fVar212;
                                auVar173._4_4_ = auVar186._4_4_ * fVar213;
                                auVar173._8_4_ = auVar186._8_4_ * fVar215;
                                auVar173._12_4_ = auVar186._12_4_ * fVar216;
                                auVar173._16_4_ = auVar186._16_4_ * fVar217;
                                auVar173._20_4_ = auVar186._20_4_ * fVar218;
                                auVar173._24_4_ = auVar186._24_4_ * fVar219;
                                auVar173._28_4_ = 0;
                                auVar110 = vfmadd213ps_fma(local_2ec0,(undefined1  [32])local_2d40,
                                                           auVar173);
                                auVar147 = vfmadd213ps_fma(local_2ea0,(undefined1  [32])local_2d20,
                                                           ZEXT1632(auVar110));
                                auVar132 = vrcpps_avx(auVar129);
                                auVar193._8_4_ = 0x3f800000;
                                auVar193._0_8_ = 0x3f8000003f800000;
                                auVar193._12_4_ = 0x3f800000;
                                auVar193._16_4_ = 0x3f800000;
                                auVar193._20_4_ = 0x3f800000;
                                auVar193._24_4_ = 0x3f800000;
                                auVar193._28_4_ = 0x3f800000;
                                auVar110 = vfnmadd213ps_fma(auVar132,auVar129,auVar193);
                                auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar132,auVar132);
                                local_2d60 = ZEXT1632(CONCAT412((auVar147._12_4_ + auVar147._12_4_)
                                                                * auVar110._12_4_,
                                                                CONCAT48((auVar147._8_4_ +
                                                                         auVar147._8_4_) *
                                                                         auVar110._8_4_,
                                                                         CONCAT44((auVar147._4_4_ +
                                                                                  auVar147._4_4_) *
                                                                                  auVar110._4_4_,
                                                                                  (auVar147._0_4_ +
                                                                                  auVar147._0_4_) *
                                                                                  auVar110._0_4_))))
                                ;
                                auVar132 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),local_2d60,
                                                      2);
                                auVar191 = vcmpps_avx(local_2d60,*(undefined1 (*) [32])(ray + 0x100)
                                                      ,2);
                                auVar132 = vandps_avx(auVar132,auVar191);
                                auVar178._0_4_ = (uint)fVar109 ^ local_2c60._0_4_;
                                auVar178._4_4_ = (uint)fVar108 ^ local_2c60._4_4_;
                                auVar178._8_4_ = (uint)fVar140 ^ local_2c60._8_4_;
                                auVar178._12_4_ = (uint)fVar143 ^ local_2c60._12_4_;
                                auVar178._16_4_ = local_2c60._16_4_;
                                auVar178._20_4_ = local_2c60._20_4_;
                                auVar178._24_4_ = local_2c60._24_4_;
                                auVar178._28_4_ = local_2c60._28_4_;
                                auVar191 = vcmpps_avx(auVar129,auVar178,4);
                                auVar132 = vandps_avx(auVar191,auVar132);
                                auVar132 = vpslld_avx2(auVar132,0x1f);
                                auVar132 = vpsrad_avx2(auVar132,0x1f);
                                auVar191 = auVar181 & auVar132;
                                auVar132 = vandps_avx(auVar132,auVar181);
                                auVar207 = ZEXT3264(auVar132);
                                auVar127 = local_2ae0;
                                if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar191 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar191 >> 0x5f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar191 >> 0x7f,0) == '\0'
                                       ) && (auVar191 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                     SUB321(auVar191 >> 0xbf,0) == '\0') &&
                                    (auVar191 & (undefined1  [32])0x100000000) ==
                                    (undefined1  [32])0x0) && -1 < auVar191[0x1f])
                                goto LAB_015dac92;
                                local_2f60 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)auVar186
                                ;
                                auVar128 = local_2b00;
                              }
                              auVar211 = ZEXT3264(CONCAT428(0x3f800003,
                                                            CONCAT424(0x3f800003,
                                                                      CONCAT420(0x3f800003,
                                                                                CONCAT416(0x3f800003
                                                                                          ,CONCAT412
                                                  (0x3f800003,
                                                   CONCAT48(0x3f800003,0x3f8000033f800003)))))));
                              auVar210 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                            CONCAT424(0x3f7ffffa,
                                                                      CONCAT420(0x3f7ffffa,
                                                                                CONCAT416(0x3f7ffffa
                                                                                          ,CONCAT412
                                                  (0x3f7ffffa,
                                                   CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                              auVar209 = ZEXT3264(CONCAT428(0x7f800000,
                                                            CONCAT424(0x7f800000,
                                                                      CONCAT420(0x7f800000,
                                                                                CONCAT416(0x7f800000
                                                                                          ,CONCAT412
                                                  (0x7f800000,
                                                   CONCAT48(0x7f800000,0x7f8000007f800000)))))));
                              auVar194 = ZEXT3264(auVar128);
                              auVar132 = auVar207._0_32_;
                              auVar152 = auVar161._0_32_;
                              local_3020 = auVar166;
                              local_2c60 = auVar79;
                              if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar132 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar132 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar132 >> 0x7f,0) == '\0')
                                    && (auVar207 & (undefined1  [64])0x100000000) ==
                                       (undefined1  [64])0x0) && SUB321(auVar132 >> 0xbf,0) == '\0')
                                  && (auVar207 & (undefined1  [64])0x100000000) ==
                                     (undefined1  [64])0x0) && -1 < auVar207[0x1f]) {
                                auVar207 = ZEXT3264(auVar128);
                                _local_2fa0 = auVar26;
                              }
                              else {
                                auVar181 = vsubps_avx(local_2dc0,auVar128);
                                auVar152 = vsubps_avx(local_2dc0,auVar152);
                                auVar151._0_4_ = (float)(int)(*(ushort *)(lVar25 + 8 + lVar99) - 1);
                                auVar151._4_12_ = auVar214;
                                auVar110 = vrcpss_avx(auVar151,auVar151);
                                _auStack_2f98 = SUB3224(*(undefined1 (*) [32])pRVar1,8);
                                local_2fa0 = auVar94;
                                auVar189._0_4_ = (float)(int)(*(ushort *)(lVar25 + 10 + lVar99) - 1)
                                ;
                                auVar189._4_12_ = auVar214;
                                auVar203 = ZEXT464(0x40000000);
                                auVar147 = vfnmadd213ss_fma(auVar151,auVar110,auVar203._0_16_);
                                fVar109 = auVar110._0_4_ * auVar147._0_4_;
                                auVar110 = vrcpss_avx(auVar189,auVar189);
                                auVar147 = vfnmadd213ss_fma(auVar189,auVar110,auVar203._0_16_);
                                fVar108 = auVar110._0_4_ * auVar147._0_4_;
                                fVar140 = (float)(int)((SUB84(auVar94,0) & 1) + uVar92);
                                auVar190._0_4_ = auVar181._0_4_ + local_2dc0._0_4_ * fVar140;
                                auVar190._4_4_ = auVar181._4_4_ + local_2dc0._4_4_ * fVar140;
                                auVar190._8_4_ = auVar181._8_4_ + local_2dc0._8_4_ * fVar140;
                                auVar190._12_4_ = auVar181._12_4_ + local_2dc0._12_4_ * fVar140;
                                fVar143 = auVar181._16_4_ + local_2dc0._16_4_ * fVar140;
                                fVar195 = auVar181._20_4_ + local_2dc0._20_4_ * fVar140;
                                fVar196 = auVar181._24_4_ + local_2dc0._24_4_ * fVar140;
                                auVar194 = ZEXT3264(CONCAT428(auVar181._28_4_ + fVar140,
                                                              CONCAT424(fVar196,CONCAT420(fVar195,
                                                  CONCAT416(fVar143,auVar190)))));
                                auVar72._4_4_ = auVar190._4_4_ * fVar109;
                                auVar72._0_4_ = auVar190._0_4_ * fVar109;
                                auVar72._8_4_ = auVar190._8_4_ * fVar109;
                                auVar72._12_4_ = auVar190._12_4_ * fVar109;
                                auVar72._16_4_ = fVar143 * fVar109;
                                auVar72._20_4_ = fVar195 * fVar109;
                                auVar72._24_4_ = fVar196 * fVar109;
                                auVar72._28_4_ = fVar109;
                                auVar181 = vblendvps_avx(auVar181,auVar72,auVar132);
                                auVar207 = ZEXT3264(auVar181);
                                fVar109 = (float)(int)(((uint)((ulong)auVar94 >> 1) & 0x7fffffff) +
                                                      uVar90);
                                auVar73._4_4_ =
                                     (auVar152._4_4_ + local_2dc0._4_4_ * fVar109) * fVar108;
                                auVar73._0_4_ =
                                     (auVar152._0_4_ + local_2dc0._0_4_ * fVar109) * fVar108;
                                auVar73._8_4_ =
                                     (auVar152._8_4_ + local_2dc0._8_4_ * fVar109) * fVar108;
                                auVar73._12_4_ =
                                     (auVar152._12_4_ + local_2dc0._12_4_ * fVar109) * fVar108;
                                auVar73._16_4_ =
                                     (auVar152._16_4_ + local_2dc0._16_4_ * fVar109) * fVar108;
                                auVar73._20_4_ =
                                     (auVar152._20_4_ + local_2dc0._20_4_ * fVar109) * fVar108;
                                auVar73._24_4_ =
                                     (auVar152._24_4_ + local_2dc0._24_4_ * fVar109) * fVar108;
                                auVar73._28_4_ = auVar152._28_4_ + fVar109;
                                auVar161 = ZEXT3264(auVar73);
                                auVar152 = vblendvps_avx(auVar152,auVar73,auVar132);
                                uVar5 = *(uint *)((long)&local_2c70 + (long)auVar94 * 4);
                                unaff_R14 = (undefined1  [8])(ulong)uVar5;
                                pGVar6 = (context->scene->geometries).items[(long)unaff_R14].ptr;
                                uVar89 = pGVar6->mask;
                                auVar133._4_4_ = uVar89;
                                auVar133._0_4_ = uVar89;
                                auVar133._8_4_ = uVar89;
                                auVar133._12_4_ = uVar89;
                                auVar133._16_4_ = uVar89;
                                auVar133._20_4_ = uVar89;
                                auVar133._24_4_ = uVar89;
                                auVar133._28_4_ = uVar89;
                                auVar186 = vpand_avx2(auVar133,*(undefined1 (*) [32])(ray + 0x120));
                                auVar128 = vpcmpeqd_avx2(auVar186,_DAT_01f7b000);
                                auVar186 = auVar132 & ~auVar128;
                                if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar186 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar186 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar186 >> 0x7f,0) != '\0'
                                       ) || (auVar186 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                     SUB321(auVar186 >> 0xbf,0) != '\0') ||
                                    (auVar186 & (undefined1  [32])0x100000000) !=
                                    (undefined1  [32])0x0) || auVar186[0x1f] < '\0') {
                                  local_2e80._0_4_ =
                                       *(undefined4 *)((long)&local_2c80 + (long)auVar94 * 4);
                                  auVar166 = vandnps_avx(auVar128,auVar132);
                                  auVar223 = ZEXT3264(local_2e40);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    local_2ec0._0_4_ = uVar90;
                                    local_2ea0._0_4_ = uVar92;
                                    auVar186 = vrcpps_avx(local_2dc0);
                                    auVar132 = vandps_avx(local_2dc0,local_2a80);
                                    auVar180._8_4_ = 0x3f800000;
                                    auVar180._0_8_ = 0x3f8000003f800000;
                                    auVar180._12_4_ = 0x3f800000;
                                    auVar180._16_4_ = 0x3f800000;
                                    auVar180._20_4_ = 0x3f800000;
                                    auVar180._24_4_ = 0x3f800000;
                                    auVar180._28_4_ = 0x3f800000;
                                    auVar110 = vfnmadd213ps_fma(auVar186,local_2dc0,auVar180);
                                    auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar186,auVar186)
                                    ;
                                    auVar135._8_4_ = 0x219392ef;
                                    auVar135._0_8_ = 0x219392ef219392ef;
                                    auVar135._12_4_ = 0x219392ef;
                                    auVar135._16_4_ = 0x219392ef;
                                    auVar135._20_4_ = 0x219392ef;
                                    auVar135._24_4_ = 0x219392ef;
                                    auVar135._28_4_ = 0x219392ef;
                                    auVar186 = vcmpps_avx(auVar132,auVar135,5);
                                    auVar186 = vandps_avx(auVar186,ZEXT1632(auVar110));
                                    auVar76._4_4_ = auVar181._4_4_ * auVar186._4_4_;
                                    auVar76._0_4_ = auVar181._0_4_ * auVar186._0_4_;
                                    auVar76._8_4_ = auVar181._8_4_ * auVar186._8_4_;
                                    auVar76._12_4_ = auVar181._12_4_ * auVar186._12_4_;
                                    auVar76._16_4_ = auVar181._16_4_ * auVar186._16_4_;
                                    auVar76._20_4_ = auVar181._20_4_ * auVar186._20_4_;
                                    auVar76._24_4_ = auVar181._24_4_ * auVar186._24_4_;
                                    auVar76._28_4_ = auVar132._28_4_;
                                    local_2ba0 = vminps_avx(auVar76,auVar180);
                                    auVar77._4_4_ = auVar152._4_4_ * auVar186._4_4_;
                                    auVar77._0_4_ = auVar152._0_4_ * auVar186._0_4_;
                                    auVar77._8_4_ = auVar152._8_4_ * auVar186._8_4_;
                                    auVar77._12_4_ = auVar152._12_4_ * auVar186._12_4_;
                                    auVar77._16_4_ = auVar152._16_4_ * auVar186._16_4_;
                                    auVar77._20_4_ = auVar152._20_4_ * auVar186._20_4_;
                                    auVar77._24_4_ = auVar152._24_4_ * auVar186._24_4_;
                                    auVar77._28_4_ = auVar186._28_4_;
                                    local_2bc0 = vminps_avx(auVar77,auVar180);
                                    local_2c40.field_0.x.field_0 =
                                         (vfloat_impl<8>)(vfloat_impl<8>)local_2d20;
                                    local_2c40.field_0.y.field_0 =
                                         (vfloat_impl<8>)(vfloat_impl<8>)local_2d40;
                                    local_2c40._64_32_ = (undefined1  [32])local_2f60;
                                    local_2be0 = local_2d60._0_8_;
                                    uStack_2bd8 = local_2d60._8_8_;
                                    uStack_2bd0 = local_2d60._16_8_;
                                    uStack_2bc8 = local_2d60._24_8_;
                                    local_2ff0.valid = (int *)local_29e0;
                                    local_2ff0.geometryUserPtr = &local_2a40;
                                    local_2ff0.context = local_2a20;
                                    local_2ff0.ray = (RTCRayN *)&local_2ca0;
                                    local_2f20 = (undefined1  [8])pGVar6;
                                    auVar194 = ZEXT1664(auVar190);
                                    auVar203 = ZEXT1664(local_2dc0._0_16_);
                                    local_2fc0 = auVar181;
                                    local_2f40 = auVar152;
                                    local_2e20 = auVar166;
                                    std::
                                    _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                                    ::
                                    _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                                              ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                                *)&local_2ff0,
                                               (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                                *)&local_2c40.field_0);
                                    pRVar9 = context->user;
                                    local_2ba0._4_4_ = local_2e80._0_4_;
                                    local_2ba0._0_4_ = local_2e80._0_4_;
                                    local_2ba0._8_4_ = local_2e80._0_4_;
                                    local_2ba0._12_4_ = local_2e80._0_4_;
                                    local_2ba0._16_4_ = local_2e80._0_4_;
                                    local_2ba0._20_4_ = local_2e80._0_4_;
                                    local_2ba0._24_4_ = local_2e80._0_4_;
                                    local_2ba0._28_4_ = local_2e80._0_4_;
                                    local_2c40._16_8_ = uStack_29d0;
                                    local_2c40._0_16_ = local_29e0;
                                    local_2c40._24_8_ = uStack_29c8;
                                    local_2be0 = local_2ca0._0_8_;
                                    uStack_2bd8 = local_2ca0._8_8_;
                                    uStack_2bd0 = local_2ca0._16_8_;
                                    uStack_2bc8 = local_2ca0._24_8_;
                                    local_2b80 = uVar5;
                                    uStack_2b7c = uVar5;
                                    uStack_2b78 = uVar5;
                                    uStack_2b74 = uVar5;
                                    uStack_2b70 = uVar5;
                                    uStack_2b6c = uVar5;
                                    uStack_2b68 = uVar5;
                                    uStack_2b64 = uVar5;
                                    auVar159 = vpcmpeqd_avx2(local_2ba0,local_2ba0);
                                    local_2e50[1] = auVar159;
                                    *local_2e50 = auVar159;
                                    local_2b60 = pRVar9->instID[0];
                                    uStack_2b5c = local_2b60;
                                    uStack_2b58 = local_2b60;
                                    uStack_2b54 = local_2b60;
                                    uStack_2b50 = local_2b60;
                                    uStack_2b4c = local_2b60;
                                    uStack_2b48 = local_2b60;
                                    uStack_2b44 = local_2b60;
                                    local_2b40 = pRVar9->instPrimID[0];
                                    uStack_2b3c = local_2b40;
                                    uStack_2b38 = local_2b40;
                                    uStack_2b34 = local_2b40;
                                    uStack_2b30 = local_2b40;
                                    uStack_2b2c = local_2b40;
                                    uStack_2b28 = local_2b40;
                                    uStack_2b24 = local_2b40;
                                    _local_2e80 = *(undefined1 (*) [32])(ray + 0x100);
                                    auVar166 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x100),
                                                             (undefined1  [32])local_2a40,local_2e20
                                                            );
                                    *(undefined1 (*) [32])(ray + 0x100) = auVar166;
                                    local_2e00 = local_2e20;
                                    unaff_R14 = local_2f20;
                                    local_2ff0.geometryUserPtr =
                                         (void *)*(undefined8 *)((long)local_2f20 + 0x18);
                                    local_2ff0.valid = (int *)local_2e00;
                                    local_2ff0.context = context->user;
                                    local_2ff0.ray = (RTCRayN *)ray;
                                    local_2ff0.hit = (RTCHitN *)&local_2c40;
                                    local_2ff0.N = 8;
                                    if (*(code **)((long)local_2f20 + 0x48) != (code *)0x0) {
                                      auVar194 = ZEXT1664(auVar194._0_16_);
                                      auVar203 = ZEXT1664(auVar203._0_16_);
                                      (**(code **)((long)local_2f20 + 0x48))(&local_2ff0);
                                      auVar210._8_56_ = extraout_var_00;
                                      auVar210._0_8_ = extraout_XMM1_Qa_00;
                                      auVar159 = vpcmpeqd_avx2(auVar210._0_32_,auVar210._0_32_);
                                    }
                                    auVar166 = vpcmpeqd_avx2(local_2e00,_DAT_01f7b000);
                                    auVar152 = auVar159 & ~auVar166;
                                    auVar209 = ZEXT3264(CONCAT428(0x7f800000,
                                                                  CONCAT424(0x7f800000,
                                                                            CONCAT420(0x7f800000,
                                                                                      CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                                    auVar210 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                                  CONCAT424(0x3f7ffffa,
                                                                            CONCAT420(0x3f7ffffa,
                                                                                      CONCAT416(
                                                  0x3f7ffffa,
                                                  CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                  )))));
                                    auVar211 = ZEXT3264(CONCAT428(0x3f800003,
                                                                  CONCAT424(0x3f800003,
                                                                            CONCAT420(0x3f800003,
                                                                                      CONCAT416(
                                                  0x3f800003,
                                                  CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                  )))));
                                    auVar223 = ZEXT3264(local_2e40);
                                    auVar207 = ZEXT3264(local_2fc0);
                                    uVar90 = local_2ec0._0_4_;
                                    uVar92 = local_2ea0._0_4_;
                                    if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar152 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar152 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar152 >> 0x7f,0) == '\0') &&
                                          (auVar152 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar152 >> 0xbf,0) == '\0') &&
                                        (auVar152 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar152[0x1f]) {
                                      auVar166 = auVar166 ^ auVar159;
                                      auVar94 = local_2fa0;
                                    }
                                    else {
                                      p_Var8 = context->args->filter;
                                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          ((*(byte *)((long)unaff_R14 + 0x3e) & 0x40) != 0)))) {
                                        auVar194 = ZEXT1664(auVar194._0_16_);
                                        auVar203 = ZEXT1664(auVar203._0_16_);
                                        (*p_Var8)(&local_2ff0);
                                        auVar207 = ZEXT3264(local_2fc0);
                                        auVar223 = ZEXT3264(local_2e40);
                                        auVar211 = ZEXT3264(CONCAT428(0x3f800003,
                                                                      CONCAT424(0x3f800003,
                                                                                CONCAT420(0x3f800003
                                                                                          ,CONCAT416
                                                  (0x3f800003,
                                                   CONCAT412(0x3f800003,
                                                             CONCAT48(0x3f800003,0x3f8000033f800003)
                                                            ))))));
                                        auVar210 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                                      CONCAT424(0x3f7ffffa,
                                                                                CONCAT420(0x3f7ffffa
                                                                                          ,CONCAT416
                                                  (0x3f7ffffa,
                                                   CONCAT412(0x3f7ffffa,
                                                             CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                            ))))));
                                        auVar209 = ZEXT3264(CONCAT428(0x7f800000,
                                                                      CONCAT424(0x7f800000,
                                                                                CONCAT420(0x7f800000
                                                                                          ,CONCAT416
                                                  (0x7f800000,
                                                   CONCAT412(0x7f800000,
                                                             CONCAT48(0x7f800000,0x7f8000007f800000)
                                                            ))))));
                                        uVar90 = local_2ec0._0_4_;
                                        uVar92 = local_2ea0._0_4_;
                                      }
                                      auVar152 = vpcmpeqd_avx2(local_2e00,_DAT_01f7b000);
                                      auVar166 = auVar152 ^ _DAT_01f7b020;
                                      auVar159._8_4_ = 0xff800000;
                                      auVar159._0_8_ = 0xff800000ff800000;
                                      auVar159._12_4_ = 0xff800000;
                                      auVar159._16_4_ = 0xff800000;
                                      auVar159._20_4_ = 0xff800000;
                                      auVar159._24_4_ = 0xff800000;
                                      auVar159._28_4_ = 0xff800000;
                                      auVar152 = vblendvps_avx(auVar159,*(undefined1 (*) [32])
                                                                         (local_2ff0.ray + 0x100),
                                                               auVar152);
                                      *(undefined1 (*) [32])(local_2ff0.ray + 0x100) = auVar152;
                                      auVar94 = local_2fa0;
                                    }
                                    auVar161 = ZEXT3264(auVar159);
                                    auVar152 = vblendvps_avx(_local_2e80,
                                                             *(undefined1 (*) [32])local_2f68,
                                                             auVar166);
                                    *(undefined1 (*) [32])local_2f68 = auVar152;
                                    auVar152 = local_2f40;
                                  }
                                  auVar166 = vandnps_avx(auVar166,local_3020);
                                  auVar205 = ZEXT3264(auVar166);
                                  goto LAB_015dabff;
                                }
                              }
                              auVar223 = ZEXT3264(local_2e40);
                              auVar205 = ZEXT3264(auVar166);
                            }
LAB_015dabff:
                            auVar132 = auVar223._0_32_;
                            auVar94 = (undefined1  [8])((long)auVar94 + 1);
                            puVar96 = puVar96 + 8;
                            auVar166 = auVar205._0_32_;
                            in_ZMM13 = ZEXT3264(auVar207._0_32_);
                            in_ZMM14 = ZEXT3264(auVar152);
                          } while ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0 ||
                                        (auVar166 >> 0x3f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar166 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) || SUB321(auVar166 >> 0x7f,0) != '\0')
                                     || (auVar205 & (undefined1  [64])0x100000000) !=
                                        (undefined1  [64])0x0) || SUB321(auVar166 >> 0xbf,0) != '\0'
                                    ) || (auVar205 & (undefined1  [64])0x100000000) !=
                                         (undefined1  [64])0x0) || auVar205[0x1f] < '\0');
                          auVar181 = auVar132 & auVar166;
                          bVar105 = (((((((auVar181 >> 0x1f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar181 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar181 >> 0x5f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar181 >> 0x7f,0) == '\0'
                                       ) && (auVar181 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                     SUB321(auVar181 >> 0xbf,0) == '\0') &&
                                    (auVar181 & (undefined1  [32])0x100000000) ==
                                    (undefined1  [32])0x0) && -1 < auVar181[0x1f];
                          auVar166 = vandps_avx(auVar166,auVar132);
                          in_ZMM13 = ZEXT3264(auVar207._0_32_);
                          in_ZMM14 = ZEXT3264(auVar152);
                          lVar93 = local_2d70;
                          uVar97 = local_2d68;
                          uVar98 = local_2e48;
                        }
                        auVar223 = ZEXT3264(auVar166);
                      } while ((!bVar105) && (uVar97 = uVar97 - 1 & uVar97, uVar97 != 0));
                    }
                    lVar93 = local_2d78 + 1;
                  }
                  auVar166 = vpcmpeqd_avx2(auVar161._0_32_,auVar161._0_32_);
                  local_2ce0 = vpor_avx2(auVar223._0_32_ ^ auVar166,local_2ce0);
                  auVar166 = auVar166 & ~local_2ce0;
                  if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar166 >> 0x7f,0) == '\0') &&
                        (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar166 >> 0xbf,0) == '\0') &&
                      (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar166[0x1f]) goto LAB_015db849;
                  auVar161 = ZEXT3264(local_27e0);
                  auVar174._8_4_ = 0xff800000;
                  auVar174._0_8_ = 0xff800000ff800000;
                  auVar174._12_4_ = 0xff800000;
                  auVar174._16_4_ = 0xff800000;
                  auVar174._20_4_ = 0xff800000;
                  auVar174._24_4_ = 0xff800000;
                  auVar174._28_4_ = 0xff800000;
                  local_27e0 = vblendvps_avx(local_27e0,auVar174,local_2ce0);
                }
                goto LAB_015d99ff;
              }
              auVar166 = auVar209._0_32_;
              for (lVar93 = 0;
                  (auVar223 = ZEXT3264(auVar166), lVar93 != 4 &&
                  (uVar97 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar93 * 8), uVar97 != 8));
                  lVar93 = lVar93 + 1) {
                uVar103 = *(undefined4 *)(root.ptr + 0x20 + lVar93 * 4);
                auVar118._4_4_ = uVar103;
                auVar118._0_4_ = uVar103;
                auVar118._8_4_ = uVar103;
                auVar118._12_4_ = uVar103;
                auVar118._16_4_ = uVar103;
                auVar118._20_4_ = uVar103;
                auVar118._24_4_ = uVar103;
                auVar118._28_4_ = uVar103;
                auVar79._8_8_ = local_2980._8_8_;
                auVar79._0_8_ = local_2980._0_8_;
                auVar79._16_8_ = local_2980._16_8_;
                auVar79._24_8_ = local_2980._24_8_;
                auVar81._8_8_ = local_2980._40_8_;
                auVar81._0_8_ = local_2980._32_8_;
                auVar81._16_8_ = local_2980._48_8_;
                auVar81._24_8_ = local_2980._56_8_;
                auVar83._8_8_ = local_2980._72_8_;
                auVar83._0_8_ = local_2980._64_8_;
                auVar83._16_8_ = local_2980._80_8_;
                auVar83._24_8_ = local_2980._88_8_;
                auVar152 = vsubps_avx(auVar118,auVar79);
                auVar161._0_4_ = (float)local_28c0._0_4_ * auVar152._0_4_;
                auVar161._4_4_ = (float)local_28c0._4_4_ * auVar152._4_4_;
                auVar161._8_4_ = fStack_28b8 * auVar152._8_4_;
                auVar161._12_4_ = fStack_28b4 * auVar152._12_4_;
                auVar161._16_4_ = fStack_28b0 * auVar152._16_4_;
                auVar161._20_4_ = fStack_28ac * auVar152._20_4_;
                auVar161._28_36_ = auVar194._28_36_;
                auVar161._24_4_ = fStack_28a8 * auVar152._24_4_;
                auVar181 = auVar161._0_32_;
                auVar194 = ZEXT3264(auVar181);
                uVar103 = *(undefined4 *)(root.ptr + 0x40 + lVar93 * 4);
                auVar119._4_4_ = uVar103;
                auVar119._0_4_ = uVar103;
                auVar119._8_4_ = uVar103;
                auVar119._12_4_ = uVar103;
                auVar119._16_4_ = uVar103;
                auVar119._20_4_ = uVar103;
                auVar119._24_4_ = uVar103;
                auVar119._28_4_ = uVar103;
                auVar152 = vsubps_avx(auVar119,auVar81);
                auVar223._0_4_ = (float)local_28a0._0_4_ * auVar152._0_4_;
                auVar223._4_4_ = (float)local_28a0._4_4_ * auVar152._4_4_;
                auVar223._8_4_ = fStack_2898 * auVar152._8_4_;
                auVar223._12_4_ = fStack_2894 * auVar152._12_4_;
                auVar223._16_4_ = fStack_2890 * auVar152._16_4_;
                auVar223._20_4_ = fStack_288c * auVar152._20_4_;
                auVar223._28_36_ = auVar203._28_36_;
                auVar223._24_4_ = fStack_2888 * auVar152._24_4_;
                auVar186 = auVar223._0_32_;
                auVar203 = ZEXT3264(auVar186);
                uVar103 = *(undefined4 *)(root.ptr + 0x60 + lVar93 * 4);
                auVar120._4_4_ = uVar103;
                auVar120._0_4_ = uVar103;
                auVar120._8_4_ = uVar103;
                auVar120._12_4_ = uVar103;
                auVar120._16_4_ = uVar103;
                auVar120._20_4_ = uVar103;
                auVar120._24_4_ = uVar103;
                auVar120._28_4_ = uVar103;
                auVar152 = vsubps_avx(auVar120,auVar83);
                auVar205._0_4_ = (float)local_2880._0_4_ * auVar152._0_4_;
                auVar205._4_4_ = (float)local_2880._4_4_ * auVar152._4_4_;
                auVar205._8_4_ = fStack_2878 * auVar152._8_4_;
                auVar205._12_4_ = fStack_2874 * auVar152._12_4_;
                auVar205._16_4_ = fStack_2870 * auVar152._16_4_;
                auVar205._20_4_ = fStack_286c * auVar152._20_4_;
                auVar205._28_36_ = auVar207._28_36_;
                auVar205._24_4_ = fStack_2868 * auVar152._24_4_;
                auVar128 = auVar205._0_32_;
                auVar207 = ZEXT3264(auVar128);
                uVar103 = *(undefined4 *)(root.ptr + 0x30 + lVar93 * 4);
                auVar121._4_4_ = uVar103;
                auVar121._0_4_ = uVar103;
                auVar121._8_4_ = uVar103;
                auVar121._12_4_ = uVar103;
                auVar121._16_4_ = uVar103;
                auVar121._20_4_ = uVar103;
                auVar121._24_4_ = uVar103;
                auVar121._28_4_ = uVar103;
                auVar152 = vsubps_avx(auVar121,auVar79);
                auVar21._4_4_ = (float)local_28c0._4_4_ * auVar152._4_4_;
                auVar21._0_4_ = (float)local_28c0._0_4_ * auVar152._0_4_;
                auVar21._8_4_ = fStack_28b8 * auVar152._8_4_;
                auVar21._12_4_ = fStack_28b4 * auVar152._12_4_;
                auVar21._16_4_ = fStack_28b0 * auVar152._16_4_;
                auVar21._20_4_ = fStack_28ac * auVar152._20_4_;
                auVar21._24_4_ = fStack_28a8 * auVar152._24_4_;
                auVar21._28_4_ = (int)((ulong)local_2980._24_8_ >> 0x20);
                uVar103 = *(undefined4 *)(root.ptr + 0x50 + lVar93 * 4);
                auVar122._4_4_ = uVar103;
                auVar122._0_4_ = uVar103;
                auVar122._8_4_ = uVar103;
                auVar122._12_4_ = uVar103;
                auVar122._16_4_ = uVar103;
                auVar122._20_4_ = uVar103;
                auVar122._24_4_ = uVar103;
                auVar122._28_4_ = uVar103;
                auVar152 = vsubps_avx(auVar122,auVar81);
                auVar22._4_4_ = (float)local_28a0._4_4_ * auVar152._4_4_;
                auVar22._0_4_ = (float)local_28a0._0_4_ * auVar152._0_4_;
                auVar22._8_4_ = fStack_2898 * auVar152._8_4_;
                auVar22._12_4_ = fStack_2894 * auVar152._12_4_;
                auVar22._16_4_ = fStack_2890 * auVar152._16_4_;
                auVar22._20_4_ = fStack_288c * auVar152._20_4_;
                auVar22._24_4_ = fStack_2888 * auVar152._24_4_;
                auVar22._28_4_ = (int)((ulong)local_2980._56_8_ >> 0x20);
                uVar103 = *(undefined4 *)(root.ptr + 0x70 + lVar93 * 4);
                auVar123._4_4_ = uVar103;
                auVar123._0_4_ = uVar103;
                auVar123._8_4_ = uVar103;
                auVar123._12_4_ = uVar103;
                auVar123._16_4_ = uVar103;
                auVar123._20_4_ = uVar103;
                auVar123._24_4_ = uVar103;
                auVar123._28_4_ = uVar103;
                auVar152 = vsubps_avx(auVar123,auVar83);
                auVar23._4_4_ = (float)local_2880._4_4_ * auVar152._4_4_;
                auVar23._0_4_ = (float)local_2880._0_4_ * auVar152._0_4_;
                auVar23._8_4_ = fStack_2878 * auVar152._8_4_;
                auVar23._12_4_ = fStack_2874 * auVar152._12_4_;
                auVar23._16_4_ = fStack_2870 * auVar152._16_4_;
                auVar23._20_4_ = fStack_286c * auVar152._20_4_;
                auVar23._24_4_ = fStack_2868 * auVar152._24_4_;
                auVar23._28_4_ = (int)((ulong)local_2980._88_8_ >> 0x20);
                auVar152 = vminps_avx(auVar181,auVar21);
                auVar132 = vminps_avx(auVar186,auVar22);
                auVar152 = vmaxps_avx(auVar152,auVar132);
                auVar132 = vminps_avx(auVar128,auVar23);
                auVar152 = vmaxps_avx(auVar152,auVar132);
                auVar24._4_4_ = auVar210._4_4_ * auVar152._4_4_;
                auVar24._0_4_ = auVar210._0_4_ * auVar152._0_4_;
                auVar24._8_4_ = auVar210._8_4_ * auVar152._8_4_;
                auVar24._12_4_ = auVar210._12_4_ * auVar152._12_4_;
                auVar24._16_4_ = auVar210._16_4_ * auVar152._16_4_;
                auVar24._20_4_ = auVar210._20_4_ * auVar152._20_4_;
                auVar24._24_4_ = auVar210._24_4_ * auVar152._24_4_;
                auVar24._28_4_ = auVar152._28_4_;
                auVar152 = vmaxps_avx(auVar181,auVar21);
                auVar132 = vmaxps_avx(auVar186,auVar22);
                auVar132 = vminps_avx(auVar152,auVar132);
                auVar152 = vmaxps_avx(auVar128,auVar23);
                auVar152 = vminps_avx(auVar132,auVar152);
                auVar26._4_4_ = auVar211._4_4_ * auVar152._4_4_;
                auVar26._0_4_ = auVar211._0_4_ * auVar152._0_4_;
                auVar26._8_4_ = auVar211._8_4_ * auVar152._8_4_;
                auVar26._12_4_ = auVar211._12_4_ * auVar152._12_4_;
                auVar26._16_4_ = auVar211._16_4_ * auVar152._16_4_;
                auVar26._20_4_ = auVar211._20_4_ * auVar152._20_4_;
                auVar26._24_4_ = auVar211._24_4_ * auVar152._24_4_;
                auVar26._28_4_ = auVar152._28_4_;
                auVar152 = vmaxps_avx(auVar24,local_2800);
                auVar132 = vminps_avx(auVar26,local_27e0);
                auVar132 = vcmpps_avx(auVar152,auVar132,2);
                auVar161 = ZEXT3264(auVar132);
                uVar91 = uVar101;
                auVar152 = auVar166;
                if (((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar132 >> 0x7f,0) != '\0') ||
                       (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar132 >> 0xbf,0) != '\0') ||
                     (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar132[0x1f] < '\0') &&
                   (auVar152 = vblendvps_avx(auVar209._0_32_,auVar24,auVar132), uVar91 = uVar97,
                   uVar101 != 8)) {
                  *puVar104 = uVar101;
                  puVar104 = puVar104 + 1;
                  *pauVar102 = auVar166;
                  pauVar102 = pauVar102 + 1;
                }
                auVar166 = auVar152;
                uVar101 = uVar91;
              }
              if (uVar101 == 8) goto LAB_015d9bbe;
              auVar152 = vcmpps_avx(local_27e0,auVar166,6);
              uVar103 = vmovmskps_avx(auVar152);
              root.ptr = uVar101;
            } while ((byte)uVar98 < (byte)POPCOUNT(uVar103));
            *puVar104 = uVar101;
            puVar104 = puVar104 + 1;
            *pauVar102 = auVar166;
            pauVar102 = pauVar102 + 1;
LAB_015d9bbe:
            iVar88 = 4;
          }
          else {
            local_2fc0 = auVar166;
            local_2f00 = in_ZMM14._0_32_;
            local_2ee0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)in_ZMM13._0_32_;
            while (unaff_R14 != (undefined1  [8])0x0) {
              k = 0;
              for (uVar98 = (ulong)unaff_R14; (uVar98 & 1) == 0;
                  uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              unaff_R14 = (undefined1  [8])((long)unaff_R14 - 1U & (ulong)unaff_R14);
              local_3020._0_8_ = k;
              auVar161 = ZEXT1664(auVar161._0_16_);
              auVar194 = ZEXT1664(auVar194._0_16_);
              auVar203 = ZEXT1664(auVar203._0_16_);
              auVar207 = ZEXT1664(auVar207._0_16_);
              bVar105 = occluded1(local_2d88,local_2d90,root,k,&local_3021,ray,
                                  (TravRayK<8,_true> *)&local_2980.field_0,context);
              uVar98 = local_2e48;
              if (bVar105) {
                *(undefined4 *)(local_2ce0 + local_3020._0_8_ * 4) = 0xffffffff;
              }
            }
            auVar166 = _DAT_01f7b020 & ~local_2ce0;
            iVar88 = 3;
            auVar209 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar210 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                          CONCAT424(0x3f7ffffa,
                                                    CONCAT420(0x3f7ffffa,
                                                              CONCAT416(0x3f7ffffa,
                                                                        CONCAT412(0x3f7ffffa,
                                                                                  CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
            auVar211 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            in_ZMM13 = ZEXT3264((undefined1  [32])local_2ee0);
            in_ZMM14 = ZEXT3264(local_2f00);
            auVar223 = ZEXT3264(local_2fc0);
            if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar166 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar166 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar166 >> 0x7f,0) != '\0') ||
                  (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar166 >> 0xbf,0) != '\0') ||
                (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar166[0x1f] < '\0') {
              auVar161 = ZEXT3264(local_27e0);
              auVar166._8_4_ = 0xff800000;
              auVar166._0_8_ = 0xff800000ff800000;
              auVar166._12_4_ = 0xff800000;
              auVar166._16_4_ = 0xff800000;
              auVar166._20_4_ = 0xff800000;
              auVar166._24_4_ = 0xff800000;
              auVar166._28_4_ = 0xff800000;
              local_27e0 = vblendvps_avx(local_27e0,auVar166,local_2ce0);
              iVar88 = 2;
            }
            unaff_R14 = (undefined1  [8])0x0;
            if ((uint)uVar98 < (uint)POPCOUNT(uVar103)) goto LAB_015d9a3e;
          }
        } while ((iVar88 == 4) || (iVar88 == 2));
LAB_015db849:
        auVar166 = vandps_avx(local_26c0,local_2ce0);
        auVar160._8_4_ = 0xff800000;
        auVar160._0_8_ = 0xff800000ff800000;
        auVar160._12_4_ = 0xff800000;
        auVar160._16_4_ = 0xff800000;
        auVar160._20_4_ = 0xff800000;
        auVar160._24_4_ = 0xff800000;
        auVar160._28_4_ = 0xff800000;
        auVar166 = vmaskmovps_avx(auVar166,auVar160);
        *(undefined1 (*) [32])local_2f68 = auVar166;
        return;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }